

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  ulong uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  byte bVar102;
  ulong uVar103;
  uint uVar104;
  long lVar105;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  Geometry *pGVar106;
  long lVar107;
  undefined8 unaff_R13;
  ulong uVar108;
  ulong uVar109;
  uint uVar110;
  byte bVar111;
  float fVar112;
  float fVar164;
  float fVar166;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar120 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar170;
  float fVar171;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar172;
  undefined4 uVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  undefined1 auVar185 [64];
  undefined1 auVar188 [32];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar208;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  undefined1 (*local_7f0) [32];
  LinearSpace3fa *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  int local_53c;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar103 = (ulong)(byte)prim[1];
  fVar189 = *(float *)(prim + uVar103 * 0x19 + 0x12);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar117 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar176 = vsubps_avx(auVar33,*(undefined1 (*) [16])(prim + uVar103 * 0x19 + 6));
  fVar196 = fVar189 * auVar176._0_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar33);
  fVar172 = fVar189 * auVar117._0_4_;
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar124 = vpmovsxbd_avx2(auVar118);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar138 = vpmovsxbd_avx2(auVar119);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar137 = vpmovsxbd_avx2(auVar8);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar103 * 0xc + 6);
  auVar136 = vpmovsxbd_avx2(auVar9);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar125 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar127 = vpmovsxbd_avx2(auVar11);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar103 * 0x13 + 6);
  auVar135 = vpmovsxbd_avx2(auVar12);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar103 * 0x14 + 6);
  auVar129 = vpmovsxbd_avx2(auVar13);
  auVar128 = vcvtdq2ps_avx(auVar129);
  auVar234._8_4_ = 1;
  auVar234._0_8_ = 0x100000001;
  auVar234._12_4_ = 1;
  auVar234._16_4_ = 1;
  auVar234._20_4_ = 1;
  auVar234._24_4_ = 1;
  auVar234._28_4_ = 1;
  auVar232._4_4_ = fVar172;
  auVar232._0_4_ = fVar172;
  auVar232._8_4_ = fVar172;
  auVar232._12_4_ = fVar172;
  auVar232._16_4_ = fVar172;
  auVar232._20_4_ = fVar172;
  auVar232._24_4_ = fVar172;
  auVar232._28_4_ = fVar172;
  auVar123 = ZEXT1632(CONCAT412(fVar189 * auVar117._12_4_,
                                CONCAT48(fVar189 * auVar117._8_4_,
                                         CONCAT44(fVar189 * auVar117._4_4_,fVar172))));
  auVar130 = vpermps_avx2(auVar234,auVar123);
  auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar122 = vpermps_avx512vl(auVar121,auVar123);
  fVar172 = auVar122._0_4_;
  auVar185._0_4_ = fVar172 * auVar138._0_4_;
  fVar186 = auVar122._4_4_;
  auVar185._4_4_ = fVar186 * auVar138._4_4_;
  fVar187 = auVar122._8_4_;
  auVar185._8_4_ = fVar187 * auVar138._8_4_;
  fVar198 = auVar122._12_4_;
  auVar185._12_4_ = fVar198 * auVar138._12_4_;
  fVar197 = auVar122._16_4_;
  auVar185._16_4_ = fVar197 * auVar138._16_4_;
  fVar208 = auVar122._20_4_;
  auVar185._20_4_ = fVar208 * auVar138._20_4_;
  fVar112 = auVar122._24_4_;
  auVar185._28_36_ = in_ZMM4._28_36_;
  auVar185._24_4_ = fVar112 * auVar138._24_4_;
  auVar123._4_4_ = auVar125._4_4_ * fVar186;
  auVar123._0_4_ = auVar125._0_4_ * fVar172;
  auVar123._8_4_ = auVar125._8_4_ * fVar187;
  auVar123._12_4_ = auVar125._12_4_ * fVar198;
  auVar123._16_4_ = auVar125._16_4_ * fVar197;
  auVar123._20_4_ = auVar125._20_4_ * fVar208;
  auVar123._24_4_ = auVar125._24_4_ * fVar112;
  auVar123._28_4_ = auVar129._28_4_;
  auVar129._4_4_ = fVar186 * auVar128._4_4_;
  auVar129._0_4_ = fVar172 * auVar128._0_4_;
  auVar129._8_4_ = fVar187 * auVar128._8_4_;
  auVar129._12_4_ = fVar198 * auVar128._12_4_;
  auVar129._16_4_ = fVar197 * auVar128._16_4_;
  auVar129._20_4_ = fVar208 * auVar128._20_4_;
  auVar129._24_4_ = fVar112 * auVar128._24_4_;
  auVar129._28_4_ = auVar122._28_4_;
  auVar33 = vfmadd231ps_fma(auVar185._0_32_,auVar130,auVar124);
  auVar118 = vfmadd231ps_fma(auVar123,auVar130,auVar136);
  auVar119 = vfmadd231ps_fma(auVar129,auVar135,auVar130);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar232,auVar126);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar232,auVar137);
  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar127,auVar232);
  auVar233._4_4_ = fVar196;
  auVar233._0_4_ = fVar196;
  auVar233._8_4_ = fVar196;
  auVar233._12_4_ = fVar196;
  auVar233._16_4_ = fVar196;
  auVar233._20_4_ = fVar196;
  auVar233._24_4_ = fVar196;
  auVar233._28_4_ = fVar196;
  auVar130 = ZEXT1632(CONCAT412(fVar189 * auVar176._12_4_,
                                CONCAT48(fVar189 * auVar176._8_4_,
                                         CONCAT44(fVar189 * auVar176._4_4_,fVar196))));
  auVar129 = vpermps_avx2(auVar234,auVar130);
  auVar123 = vpermps_avx512vl(auVar121,auVar130);
  fVar189 = auVar123._0_4_;
  fVar172 = auVar123._4_4_;
  auVar130._4_4_ = fVar172 * auVar138._4_4_;
  auVar130._0_4_ = fVar189 * auVar138._0_4_;
  fVar186 = auVar123._8_4_;
  auVar130._8_4_ = fVar186 * auVar138._8_4_;
  fVar187 = auVar123._12_4_;
  auVar130._12_4_ = fVar187 * auVar138._12_4_;
  fVar198 = auVar123._16_4_;
  auVar130._16_4_ = fVar198 * auVar138._16_4_;
  fVar197 = auVar123._20_4_;
  auVar130._20_4_ = fVar197 * auVar138._20_4_;
  fVar208 = auVar123._24_4_;
  auVar130._24_4_ = fVar208 * auVar138._24_4_;
  auVar130._28_4_ = auVar138._28_4_;
  auVar133._0_4_ = fVar189 * auVar125._0_4_;
  auVar133._4_4_ = fVar172 * auVar125._4_4_;
  auVar133._8_4_ = fVar186 * auVar125._8_4_;
  auVar133._12_4_ = fVar187 * auVar125._12_4_;
  auVar133._16_4_ = fVar198 * auVar125._16_4_;
  auVar133._20_4_ = fVar197 * auVar125._20_4_;
  auVar133._24_4_ = fVar208 * auVar125._24_4_;
  auVar133._28_4_ = 0;
  auVar125._4_4_ = fVar172 * auVar128._4_4_;
  auVar125._0_4_ = fVar189 * auVar128._0_4_;
  auVar125._8_4_ = fVar186 * auVar128._8_4_;
  auVar125._12_4_ = fVar187 * auVar128._12_4_;
  auVar125._16_4_ = fVar198 * auVar128._16_4_;
  auVar125._20_4_ = fVar197 * auVar128._20_4_;
  auVar125._24_4_ = fVar208 * auVar128._24_4_;
  auVar125._28_4_ = auVar128._28_4_;
  auVar8 = vfmadd231ps_fma(auVar130,auVar129,auVar124);
  auVar9 = vfmadd231ps_fma(auVar133,auVar129,auVar136);
  auVar10 = vfmadd231ps_fma(auVar125,auVar129,auVar135);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar233,auVar126);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar233,auVar137);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar233,auVar127);
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar224._16_4_ = 0x7fffffff;
  auVar224._20_4_ = 0x7fffffff;
  auVar224._24_4_ = 0x7fffffff;
  auVar224._28_4_ = 0x7fffffff;
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  auVar219._16_4_ = 0x219392ef;
  auVar219._20_4_ = 0x219392ef;
  auVar219._24_4_ = 0x219392ef;
  auVar219._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(auVar224,ZEXT1632(auVar33));
  uVar108 = vcmpps_avx512vl(auVar126,auVar219,1);
  bVar19 = (bool)((byte)uVar108 & 1);
  auVar121._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar33._0_4_;
  bVar19 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar121._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar33._4_4_;
  bVar19 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar121._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar33._8_4_;
  bVar19 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar121._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar33._12_4_;
  auVar121._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar121._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar121._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar121._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(auVar224,ZEXT1632(auVar118));
  uVar108 = vcmpps_avx512vl(auVar126,auVar219,1);
  bVar19 = (bool)((byte)uVar108 & 1);
  auVar122._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar118._0_4_;
  bVar19 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar118._4_4_;
  bVar19 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar118._8_4_;
  bVar19 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar118._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(auVar224,ZEXT1632(auVar119));
  uVar108 = vcmpps_avx512vl(auVar126,auVar219,1);
  bVar19 = (bool)((byte)uVar108 & 1);
  auVar126._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar119._0_4_;
  bVar19 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar126._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar119._4_4_;
  bVar19 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar126._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar119._8_4_;
  bVar19 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar126._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar119._12_4_;
  auVar126._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar126._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar126._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar126._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar124 = vrcp14ps_avx512vl(auVar121);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar221._16_4_ = 0x3f800000;
  auVar221._20_4_ = 0x3f800000;
  auVar221._24_4_ = 0x3f800000;
  auVar221._28_4_ = 0x3f800000;
  auVar33 = vfnmadd213ps_fma(auVar121,auVar124,auVar221);
  auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar122);
  auVar118 = vfnmadd213ps_fma(auVar122,auVar124,auVar221);
  auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar126);
  auVar119 = vfnmadd213ps_fma(auVar126,auVar124,auVar221);
  auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar124,auVar124);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar8));
  auVar127._4_4_ = auVar33._4_4_ * auVar126._4_4_;
  auVar127._0_4_ = auVar33._0_4_ * auVar126._0_4_;
  auVar127._8_4_ = auVar33._8_4_ * auVar126._8_4_;
  auVar127._12_4_ = auVar33._12_4_ * auVar126._12_4_;
  auVar127._16_4_ = auVar126._16_4_ * 0.0;
  auVar127._20_4_ = auVar126._20_4_ * 0.0;
  auVar127._24_4_ = auVar126._24_4_ * 0.0;
  auVar127._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar8));
  auVar134._0_4_ = auVar33._0_4_ * auVar126._0_4_;
  auVar134._4_4_ = auVar33._4_4_ * auVar126._4_4_;
  auVar134._8_4_ = auVar33._8_4_ * auVar126._8_4_;
  auVar134._12_4_ = auVar33._12_4_ * auVar126._12_4_;
  auVar134._16_4_ = auVar126._16_4_ * 0.0;
  auVar134._20_4_ = auVar126._20_4_ * 0.0;
  auVar134._24_4_ = auVar126._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0xe + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar9));
  auVar135._4_4_ = auVar118._4_4_ * auVar126._4_4_;
  auVar135._0_4_ = auVar118._0_4_ * auVar126._0_4_;
  auVar135._8_4_ = auVar118._8_4_ * auVar126._8_4_;
  auVar135._12_4_ = auVar118._12_4_ * auVar126._12_4_;
  auVar135._16_4_ = auVar126._16_4_ * 0.0;
  auVar135._20_4_ = auVar126._20_4_ * 0.0;
  auVar135._24_4_ = auVar126._24_4_ * 0.0;
  auVar135._28_4_ = auVar126._28_4_;
  auVar125 = vpbroadcastd_avx512vl();
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar9));
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x15 + 6));
  auVar132._0_4_ = auVar118._0_4_ * auVar126._0_4_;
  auVar132._4_4_ = auVar118._4_4_ * auVar126._4_4_;
  auVar132._8_4_ = auVar118._8_4_ * auVar126._8_4_;
  auVar132._12_4_ = auVar118._12_4_ * auVar126._12_4_;
  auVar132._16_4_ = auVar126._16_4_ * 0.0;
  auVar132._20_4_ = auVar126._20_4_ * 0.0;
  auVar132._24_4_ = auVar126._24_4_ * 0.0;
  auVar132._28_4_ = 0;
  auVar126 = vcvtdq2ps_avx(auVar124);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar10));
  auVar128._4_4_ = auVar126._4_4_ * auVar119._4_4_;
  auVar128._0_4_ = auVar126._0_4_ * auVar119._0_4_;
  auVar128._8_4_ = auVar126._8_4_ * auVar119._8_4_;
  auVar128._12_4_ = auVar126._12_4_ * auVar119._12_4_;
  auVar128._16_4_ = auVar126._16_4_ * 0.0;
  auVar128._20_4_ = auVar126._20_4_ * 0.0;
  auVar128._24_4_ = auVar126._24_4_ * 0.0;
  auVar128._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar10));
  auVar131._0_4_ = auVar119._0_4_ * auVar126._0_4_;
  auVar131._4_4_ = auVar119._4_4_ * auVar126._4_4_;
  auVar131._8_4_ = auVar119._8_4_ * auVar126._8_4_;
  auVar131._12_4_ = auVar119._12_4_ * auVar126._12_4_;
  auVar131._16_4_ = auVar126._16_4_ * 0.0;
  auVar131._20_4_ = auVar126._20_4_ * 0.0;
  auVar131._24_4_ = auVar126._24_4_ * 0.0;
  auVar131._28_4_ = 0;
  auVar126 = vpminsd_avx2(auVar127,auVar134);
  auVar124 = vpminsd_avx2(auVar135,auVar132);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124 = vpminsd_avx2(auVar128,auVar131);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar138._4_4_ = uVar173;
  auVar138._0_4_ = uVar173;
  auVar138._8_4_ = uVar173;
  auVar138._12_4_ = uVar173;
  auVar138._16_4_ = uVar173;
  auVar138._20_4_ = uVar173;
  auVar138._24_4_ = uVar173;
  auVar138._28_4_ = uVar173;
  auVar124 = vmaxps_avx512vl(auVar124,auVar138);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124._8_4_ = 0x3f7ffffa;
  auVar124._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar124._12_4_ = 0x3f7ffffa;
  auVar124._16_4_ = 0x3f7ffffa;
  auVar124._20_4_ = 0x3f7ffffa;
  auVar124._24_4_ = 0x3f7ffffa;
  auVar124._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar126,auVar124);
  auVar126 = vpmaxsd_avx2(auVar127,auVar134);
  auVar124 = vpmaxsd_avx2(auVar135,auVar132);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar124 = vpmaxsd_avx2(auVar128,auVar131);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar137._4_4_ = uVar173;
  auVar137._0_4_ = uVar173;
  auVar137._8_4_ = uVar173;
  auVar137._12_4_ = uVar173;
  auVar137._16_4_ = uVar173;
  auVar137._20_4_ = uVar173;
  auVar137._24_4_ = uVar173;
  auVar137._28_4_ = uVar173;
  auVar124 = vminps_avx512vl(auVar124,auVar137);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar136._8_4_ = 0x3f800003;
  auVar136._0_8_ = 0x3f8000033f800003;
  auVar136._12_4_ = 0x3f800003;
  auVar136._16_4_ = 0x3f800003;
  auVar136._20_4_ = 0x3f800003;
  auVar136._24_4_ = 0x3f800003;
  auVar136._28_4_ = 0x3f800003;
  auVar126 = vmulps_avx512vl(auVar126,auVar136);
  uVar34 = vcmpps_avx512vl(local_3a0,auVar126,2);
  uVar38 = vpcmpgtd_avx512vl(auVar125,_DAT_01fb4ba0);
  uVar108 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar34 & (byte)uVar38));
  local_7e8 = pre->ray_space + k;
  local_7f0 = (undefined1 (*) [32])local_100;
  auVar185 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar185);
  do {
    auVar126 = local_7a0;
    if (uVar108 == 0) {
      return;
    }
    lVar107 = 0;
    for (uVar103 = uVar108; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      lVar107 = lVar107 + 1;
    }
    uVar14 = *(uint *)(prim + 2);
    uVar15 = *(uint *)(prim + lVar107 * 4 + 6);
    pGVar106 = (context->scene->geometries).items[uVar14].ptr;
    uVar103 = (ulong)*(uint *)(*(long *)&pGVar106->field_0x58 +
                              pGVar106[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar15);
    p_Var18 = pGVar106[1].intersectionFilterN;
    lVar107 = *(long *)&pGVar106[1].time_range.upper;
    auVar33 = *(undefined1 (*) [16])(lVar107 + (long)p_Var18 * uVar103);
    pauVar3 = (undefined1 (*) [16])(lVar107 + (uVar103 + 1) * (long)p_Var18);
    uVar34 = *(undefined8 *)*pauVar3;
    uVar38 = *(undefined8 *)(*pauVar3 + 8);
    auVar13 = *pauVar3;
    auVar11 = *pauVar3;
    auVar9 = *pauVar3;
    auVar118 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar107 + (uVar103 + 2) * (long)p_Var18);
    uVar96 = *(undefined8 *)*pauVar4;
    uVar97 = *(undefined8 *)(*pauVar4 + 8);
    auVar12 = *pauVar4;
    auVar10 = *pauVar4;
    auVar8 = *pauVar4;
    auVar119 = *pauVar4;
    uVar108 = uVar108 - 1 & uVar108;
    pauVar5 = (undefined1 (*) [12])(lVar107 + (uVar103 + 3) * (long)p_Var18);
    uVar98 = *(undefined8 *)*pauVar5;
    uVar99 = *(undefined8 *)(*pauVar5 + 8);
    local_890 = (float)uVar98;
    fStack_88c = (float)((ulong)uVar98 >> 0x20);
    fStack_888 = (float)uVar99;
    fStack_884 = (float)((ulong)uVar99 >> 0x20);
    if (uVar108 != 0) {
      uVar109 = uVar108 - 1 & uVar108;
      for (uVar103 = uVar108; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      }
      if (uVar109 != 0) {
        for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar16 = (int)pGVar106[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar116 = vsubps_avx(auVar33,auVar117);
    uVar173 = auVar116._0_4_;
    auVar113._4_4_ = uVar173;
    auVar113._0_4_ = uVar173;
    auVar113._8_4_ = uVar173;
    auVar113._12_4_ = uVar173;
    auVar176 = vshufps_avx(auVar116,auVar116,0x55);
    aVar6 = (local_7e8->vx).field_0;
    aVar7 = (local_7e8->vy).field_0;
    auVar116 = vshufps_avx(auVar116,auVar116,0xaa);
    fVar189 = (local_7e8->vz).field_0.m128[0];
    fVar172 = *(float *)((long)&(local_7e8->vz).field_0 + 4);
    fVar186 = *(float *)((long)&(local_7e8->vz).field_0 + 8);
    fVar187 = *(float *)((long)&(local_7e8->vz).field_0 + 0xc);
    auVar223._0_4_ = fVar189 * auVar116._0_4_;
    auVar223._4_4_ = fVar172 * auVar116._4_4_;
    auVar223._8_4_ = fVar186 * auVar116._8_4_;
    auVar223._12_4_ = fVar187 * auVar116._12_4_;
    auVar176 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar176);
    auVar223 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar113);
    auVar176 = vshufps_avx(auVar33,auVar33,0xff);
    auVar113 = vsubps_avx512vl(auVar118,auVar117);
    uVar173 = auVar113._0_4_;
    auVar199._4_4_ = uVar173;
    auVar199._0_4_ = uVar173;
    auVar199._8_4_ = uVar173;
    auVar199._12_4_ = uVar173;
    auVar116 = vshufps_avx(auVar113,auVar113,0x55);
    auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar114._0_4_ = fVar189 * auVar113._0_4_;
    auVar114._4_4_ = fVar172 * auVar113._4_4_;
    auVar114._8_4_ = fVar186 * auVar113._8_4_;
    auVar114._12_4_ = fVar187 * auVar113._12_4_;
    auVar116 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar7,auVar116);
    auVar199 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar6,auVar199);
    auVar114 = vshufps_avx512vl(auVar118,auVar118,0xff);
    auVar113 = vsubps_avx512vl(auVar119,auVar117);
    uVar173 = auVar113._0_4_;
    auVar115._4_4_ = uVar173;
    auVar115._0_4_ = uVar173;
    auVar115._8_4_ = uVar173;
    auVar115._12_4_ = uVar173;
    auVar116 = vshufps_avx(auVar113,auVar113,0x55);
    auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar228._0_4_ = fVar189 * auVar113._0_4_;
    auVar228._4_4_ = fVar172 * auVar113._4_4_;
    auVar228._8_4_ = fVar186 * auVar113._8_4_;
    auVar228._12_4_ = fVar187 * auVar113._12_4_;
    auVar116 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar7,auVar116);
    auVar113 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar6,auVar115);
    auVar115 = vshufps_avx512vl(auVar119,auVar119,0xff);
    auVar39._12_4_ = fStack_884;
    auVar39._0_12_ = *pauVar5;
    auVar116 = vsubps_avx512vl(auVar39,auVar117);
    uVar173 = auVar116._0_4_;
    auVar200._4_4_ = uVar173;
    auVar200._0_4_ = uVar173;
    auVar200._8_4_ = uVar173;
    auVar200._12_4_ = uVar173;
    auVar117 = vshufps_avx(auVar116,auVar116,0x55);
    auVar116 = vshufps_avx(auVar116,auVar116,0xaa);
    auVar231._0_4_ = fVar189 * auVar116._0_4_;
    auVar231._4_4_ = fVar172 * auVar116._4_4_;
    auVar231._8_4_ = fVar186 * auVar116._8_4_;
    auVar231._12_4_ = fVar187 * auVar116._12_4_;
    auVar117 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar7,auVar117);
    auVar116 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar6,auVar200);
    auVar117 = vshufps_avx512vl(auVar39,auVar39,0xff);
    lVar107 = (long)iVar16 * 0x44;
    auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar107);
    uVar173 = auVar223._0_4_;
    local_5c0._4_4_ = uVar173;
    local_5c0._0_4_ = uVar173;
    local_5c0._8_4_ = uVar173;
    local_5c0._12_4_ = uVar173;
    local_5c0._16_4_ = uVar173;
    local_5c0._20_4_ = uVar173;
    local_5c0._24_4_ = uVar173;
    local_5c0._28_4_ = uVar173;
    auVar209._8_4_ = 1;
    auVar209._0_8_ = 0x100000001;
    auVar209._12_4_ = 1;
    auVar209._16_4_ = 1;
    auVar209._20_4_ = 1;
    auVar209._24_4_ = 1;
    auVar209._28_4_ = 1;
    local_5e0 = vpermps_avx2(auVar209,ZEXT1632(auVar223));
    local_3c0 = vbroadcastsd_avx512vl(auVar176);
    auVar138 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x484);
    uVar173 = auVar199._0_4_;
    auVar120._4_4_ = uVar173;
    auVar120._0_4_ = uVar173;
    auVar120._8_4_ = uVar173;
    auVar120._12_4_ = uVar173;
    local_600._16_4_ = uVar173;
    local_600._0_16_ = auVar120;
    local_600._20_4_ = uVar173;
    local_600._24_4_ = uVar173;
    local_600._28_4_ = uVar173;
    local_620 = vpermps_avx512vl(auVar209,ZEXT1632(auVar199));
    local_3e0 = vbroadcastsd_avx512vl(auVar114);
    auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x908);
    uVar173 = auVar113._0_4_;
    local_640._4_4_ = uVar173;
    local_640._0_4_ = uVar173;
    local_640._8_4_ = uVar173;
    local_640._12_4_ = uVar173;
    local_640._16_4_ = uVar173;
    local_640._20_4_ = uVar173;
    local_640._24_4_ = uVar173;
    local_640._28_4_ = uVar173;
    local_660 = vpermps_avx512vl(auVar209,ZEXT1632(auVar113));
    local_400 = vbroadcastsd_avx512vl(auVar115);
    auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0xd8c);
    fVar172 = auVar116._0_4_;
    local_680._4_4_ = fVar172;
    local_680._0_4_ = fVar172;
    fStack_678 = fVar172;
    fStack_674 = fVar172;
    fStack_670 = fVar172;
    fStack_66c = fVar172;
    fStack_668 = fVar172;
    register0x0000139c = fVar172;
    _local_6a0 = vpermps_avx512vl(auVar209,ZEXT1632(auVar116));
    local_420 = vbroadcastsd_avx512vl(auVar117);
    auVar125 = vmulps_avx512vl(_local_680,auVar136);
    auVar127 = vmulps_avx512vl(_local_6a0,auVar136);
    auVar117 = vfmadd231ps_fma(auVar125,auVar137,local_640);
    auVar125 = vfmadd231ps_avx512vl(auVar127,auVar137,local_660);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar138,local_600);
    auVar128 = vfmadd231ps_avx512vl(auVar125,auVar138,local_620);
    auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar124,local_5c0);
    auVar220 = ZEXT3264(auVar129);
    auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar107);
    auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x484);
    auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x908);
    auVar130 = vfmadd231ps_avx512vl(auVar128,auVar124,local_5e0);
    auVar214 = ZEXT3264(auVar130);
    auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0xd8c);
    auVar123 = vmulps_avx512vl(_local_680,auVar128);
    auVar121 = vmulps_avx512vl(_local_6a0,auVar128);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar135,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar135,local_660);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_600);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_620);
    auVar176 = vfmadd231ps_fma(auVar123,auVar125,local_5c0);
    auVar222 = ZEXT1664(auVar176);
    auVar114 = vfmadd231ps_fma(auVar121,auVar125,local_5e0);
    auVar123 = vsubps_avx512vl(ZEXT1632(auVar176),auVar129);
    auVar121 = vsubps_avx512vl(ZEXT1632(auVar114),auVar130);
    auVar122 = vmulps_avx512vl(auVar130,auVar123);
    auVar131 = vmulps_avx512vl(auVar129,auVar121);
    auVar122 = vsubps_avx512vl(auVar122,auVar131);
    auVar131 = vmulps_avx512vl(local_420,auVar136);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar137,local_400);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar138,local_3e0);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar124,local_3c0);
    auVar132 = vmulps_avx512vl(local_420,auVar128);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar135,local_400);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar127,local_3e0);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar125,local_3c0);
    auVar133 = vmulps_avx512vl(auVar121,auVar121);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar123,auVar123);
    auVar134 = vmaxps_avx512vl(auVar131,auVar132);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vmulps_avx512vl(auVar134,auVar133);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    uVar35 = vcmpps_avx512vl(auVar122,auVar133,2);
    auVar117 = vblendps_avx(auVar223,auVar33,8);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar117 = vandps_avx512vl(auVar117,auVar115);
    auVar118 = vblendps_avx(auVar199,auVar118,8);
    auVar118 = vandps_avx512vl(auVar118,auVar115);
    auVar117 = vmaxps_avx(auVar117,auVar118);
    auVar118 = vblendps_avx(auVar113,auVar119,8);
    auVar119 = vandps_avx512vl(auVar118,auVar115);
    auVar118 = vblendps_avx(auVar116,auVar39,8);
    auVar118 = vandps_avx512vl(auVar118,auVar115);
    auVar118 = vmaxps_avx(auVar119,auVar118);
    auVar118 = vmaxps_avx(auVar117,auVar118);
    auVar119 = vmovshdup_avx(auVar118);
    auVar119 = vmaxss_avx(auVar119,auVar118);
    auVar118 = vshufpd_avx(auVar118,auVar118,1);
    auVar118 = vmaxss_avx(auVar118,auVar119);
    auVar229._0_4_ = (float)iVar16;
    local_7a0._4_12_ = auVar223._4_12_;
    local_7a0._0_4_ = auVar229._0_4_;
    local_7a0._16_16_ = auVar126._16_16_;
    auVar229._4_4_ = auVar229._0_4_;
    auVar229._8_4_ = auVar229._0_4_;
    auVar229._12_4_ = auVar229._0_4_;
    auVar229._16_4_ = auVar229._0_4_;
    auVar229._20_4_ = auVar229._0_4_;
    auVar229._24_4_ = auVar229._0_4_;
    auVar229._28_4_ = auVar229._0_4_;
    uVar36 = vcmpps_avx512vl(auVar229,_DAT_01f7b060,0xe);
    bVar111 = (byte)uVar35 & (byte)uVar36;
    fVar189 = auVar118._0_4_ * 4.7683716e-07;
    local_800 = ZEXT416((uint)fVar189);
    auVar204._8_4_ = 2;
    auVar204._0_8_ = 0x200000002;
    auVar204._12_4_ = 2;
    auVar204._16_4_ = 2;
    auVar204._20_4_ = 2;
    auVar204._24_4_ = 2;
    auVar204._28_4_ = 2;
    local_760 = vpermps_avx512vl(auVar204,ZEXT1632(auVar223));
    auVar237 = ZEXT3264(local_760);
    local_780 = vpermps_avx512vl(auVar204,ZEXT1632(auVar199));
    auVar238 = ZEXT3264(local_780);
    auVar126 = vpermps_avx512vl(auVar204,ZEXT1632(auVar113));
    local_480 = vpermps_avx2(auVar204,ZEXT1632(auVar116));
    local_720 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_71c = 0;
    uStack_718 = 0;
    uStack_714 = 0;
    auVar185 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar185);
    auVar185 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar185);
    if (bVar111 != 0) {
      auVar128 = vmulps_avx512vl(local_480,auVar128);
      auVar135 = vfmadd213ps_avx512vl(auVar135,auVar126,auVar128);
      auVar127 = vfmadd213ps_avx512vl(auVar127,local_780,auVar135);
      auVar127 = vfmadd213ps_avx512vl(auVar125,local_760,auVar127);
      auVar136 = vmulps_avx512vl(local_480,auVar136);
      auVar137 = vfmadd213ps_avx512vl(auVar137,auVar126,auVar136);
      auVar135 = vfmadd213ps_avx512vl(auVar138,local_780,auVar137);
      auVar138 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x1210);
      auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x1694);
      auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x1b18);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 + 0x1f9c);
      auVar135 = vfmadd213ps_avx512vl(auVar124,local_760,auVar135);
      auVar226._0_4_ = fVar172 * auVar125._0_4_;
      auVar226._4_4_ = fVar172 * auVar125._4_4_;
      auVar226._8_4_ = fVar172 * auVar125._8_4_;
      auVar226._12_4_ = fVar172 * auVar125._12_4_;
      auVar226._16_4_ = fVar172 * auVar125._16_4_;
      auVar226._20_4_ = fVar172 * auVar125._20_4_;
      auVar226._24_4_ = fVar172 * auVar125._24_4_;
      auVar226._28_4_ = 0;
      auVar124 = vmulps_avx512vl(_local_6a0,auVar125);
      auVar125 = vmulps_avx512vl(local_480,auVar125);
      auVar128 = vfmadd231ps_avx512vl(auVar226,auVar136,local_640);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar136,local_660);
      auVar136 = vfmadd231ps_avx512vl(auVar125,auVar126,auVar136);
      auVar125 = vfmadd231ps_avx512vl(auVar128,auVar137,local_600);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar137,local_620);
      auVar128 = vfmadd231ps_avx512vl(auVar136,local_780,auVar137);
      auVar118 = vfmadd231ps_fma(auVar125,auVar138,local_5c0);
      auVar125 = vfmadd231ps_avx512vl(auVar124,auVar138,local_5e0);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x1210);
      auVar137 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x1b18);
      auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x1f9c);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_760,auVar138);
      auVar49._4_4_ = fVar172 * auVar136._4_4_;
      auVar49._0_4_ = fVar172 * auVar136._0_4_;
      auVar49._8_4_ = fVar172 * auVar136._8_4_;
      auVar49._12_4_ = fVar172 * auVar136._12_4_;
      auVar49._16_4_ = fVar172 * auVar136._16_4_;
      auVar49._20_4_ = fVar172 * auVar136._20_4_;
      auVar49._24_4_ = fVar172 * auVar136._24_4_;
      auVar49._28_4_ = auVar138._28_4_;
      auVar138 = vmulps_avx512vl(_local_6a0,auVar136);
      auVar136 = vmulps_avx512vl(local_480,auVar136);
      auVar122 = vfmadd231ps_avx512vl(auVar49,auVar137,local_640);
      auVar133 = vfmadd231ps_avx512vl(auVar138,auVar137,local_660);
      auVar237 = ZEXT3264(local_760);
      auVar238 = ZEXT3264(local_780);
      auVar185 = ZEXT3264(auVar126);
      auVar137 = vfmadd231ps_avx512vl(auVar136,auVar126,auVar137);
      auVar138 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 + 0x1694);
      auVar136 = vfmadd231ps_avx512vl(auVar122,auVar138,local_600);
      auVar122 = vfmadd231ps_avx512vl(auVar133,auVar138,local_620);
      auVar138 = vfmadd231ps_avx512vl(auVar137,local_780,auVar138);
      auVar119 = vfmadd231ps_fma(auVar136,auVar124,local_5c0);
      auVar137 = vfmadd231ps_avx512vl(auVar122,auVar124,local_5e0);
      auVar136 = vfmadd231ps_avx512vl(auVar138,local_760,auVar124);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar235._16_4_ = 0x7fffffff;
      auVar235._20_4_ = 0x7fffffff;
      auVar235._24_4_ = 0x7fffffff;
      auVar235._28_4_ = 0x7fffffff;
      auVar124 = vandps_avx(ZEXT1632(auVar118),auVar235);
      auVar138 = vandps_avx(auVar125,auVar235);
      auVar138 = vmaxps_avx(auVar124,auVar138);
      auVar124 = vandps_avx(auVar128,auVar235);
      auVar124 = vmaxps_avx(auVar138,auVar124);
      auVar230._4_4_ = fVar189;
      auVar230._0_4_ = fVar189;
      auVar230._8_4_ = fVar189;
      auVar230._12_4_ = fVar189;
      auVar230._16_4_ = fVar189;
      auVar230._20_4_ = fVar189;
      auVar230._24_4_ = fVar189;
      auVar230._28_4_ = fVar189;
      uVar103 = vcmpps_avx512vl(auVar124,auVar230,1);
      bVar19 = (bool)((byte)uVar103 & 1);
      auVar139._0_4_ = (float)((uint)bVar19 * auVar123._0_4_ | (uint)!bVar19 * auVar118._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar139._4_4_ = (float)((uint)bVar19 * auVar123._4_4_ | (uint)!bVar19 * auVar118._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar139._8_4_ = (float)((uint)bVar19 * auVar123._8_4_ | (uint)!bVar19 * auVar118._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar139._12_4_ = (float)((uint)bVar19 * auVar123._12_4_ | (uint)!bVar19 * auVar118._12_4_);
      fVar186 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar123._16_4_);
      auVar139._16_4_ = fVar186;
      fVar172 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar123._20_4_);
      auVar139._20_4_ = fVar172;
      fVar187 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar123._24_4_);
      auVar139._24_4_ = fVar187;
      uVar110 = (uint)(byte)(uVar103 >> 7) * auVar123._28_4_;
      auVar139._28_4_ = uVar110;
      bVar19 = (bool)((byte)uVar103 & 1);
      auVar140._0_4_ = (float)((uint)bVar19 * auVar121._0_4_ | (uint)!bVar19 * auVar125._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar140._4_4_ = (float)((uint)bVar19 * auVar121._4_4_ | (uint)!bVar19 * auVar125._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar140._8_4_ = (float)((uint)bVar19 * auVar121._8_4_ | (uint)!bVar19 * auVar125._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar140._12_4_ = (float)((uint)bVar19 * auVar121._12_4_ | (uint)!bVar19 * auVar125._12_4_);
      bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
      auVar140._16_4_ = (float)((uint)bVar19 * auVar121._16_4_ | (uint)!bVar19 * auVar125._16_4_);
      bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
      auVar140._20_4_ = (float)((uint)bVar19 * auVar121._20_4_ | (uint)!bVar19 * auVar125._20_4_);
      bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
      auVar140._24_4_ = (float)((uint)bVar19 * auVar121._24_4_ | (uint)!bVar19 * auVar125._24_4_);
      bVar19 = SUB81(uVar103 >> 7,0);
      auVar140._28_4_ = (uint)bVar19 * auVar121._28_4_ | (uint)!bVar19 * auVar125._28_4_;
      auVar124 = vandps_avx(auVar235,ZEXT1632(auVar119));
      auVar138 = vandps_avx(auVar137,auVar235);
      auVar138 = vmaxps_avx(auVar124,auVar138);
      auVar124 = vandps_avx(auVar136,auVar235);
      auVar124 = vmaxps_avx(auVar138,auVar124);
      uVar103 = vcmpps_avx512vl(auVar124,auVar230,1);
      bVar19 = (bool)((byte)uVar103 & 1);
      auVar141._0_4_ = (float)((uint)bVar19 * auVar123._0_4_ | (uint)!bVar19 * auVar119._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar141._4_4_ = (float)((uint)bVar19 * auVar123._4_4_ | (uint)!bVar19 * auVar119._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar141._8_4_ = (float)((uint)bVar19 * auVar123._8_4_ | (uint)!bVar19 * auVar119._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar141._12_4_ = (float)((uint)bVar19 * auVar123._12_4_ | (uint)!bVar19 * auVar119._12_4_);
      fVar208 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar123._16_4_);
      auVar141._16_4_ = fVar208;
      fVar197 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar123._20_4_);
      auVar141._20_4_ = fVar197;
      fVar198 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar123._24_4_);
      auVar141._24_4_ = fVar198;
      auVar141._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar123._28_4_;
      bVar19 = (bool)((byte)uVar103 & 1);
      auVar142._0_4_ = (float)((uint)bVar19 * auVar121._0_4_ | (uint)!bVar19 * auVar137._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar142._4_4_ = (float)((uint)bVar19 * auVar121._4_4_ | (uint)!bVar19 * auVar137._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar142._8_4_ = (float)((uint)bVar19 * auVar121._8_4_ | (uint)!bVar19 * auVar137._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar142._12_4_ = (float)((uint)bVar19 * auVar121._12_4_ | (uint)!bVar19 * auVar137._12_4_);
      bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
      auVar142._16_4_ = (float)((uint)bVar19 * auVar121._16_4_ | (uint)!bVar19 * auVar137._16_4_);
      bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
      auVar142._20_4_ = (float)((uint)bVar19 * auVar121._20_4_ | (uint)!bVar19 * auVar137._20_4_);
      bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
      auVar142._24_4_ = (float)((uint)bVar19 * auVar121._24_4_ | (uint)!bVar19 * auVar137._24_4_);
      bVar19 = SUB81(uVar103 >> 7,0);
      auVar142._28_4_ = (uint)bVar19 * auVar121._28_4_ | (uint)!bVar19 * auVar137._28_4_;
      auVar120 = vxorps_avx512vl(auVar120,auVar120);
      auVar124 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar120));
      auVar118 = vfmadd231ps_fma(auVar124,auVar140,auVar140);
      auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar118));
      fVar112 = auVar124._0_4_;
      fVar196 = auVar124._4_4_;
      fVar164 = auVar124._8_4_;
      fVar165 = auVar124._12_4_;
      fVar166 = auVar124._16_4_;
      fVar167 = auVar124._20_4_;
      fVar168 = auVar124._24_4_;
      auVar50._4_4_ = fVar196 * fVar196 * fVar196 * auVar118._4_4_ * -0.5;
      auVar50._0_4_ = fVar112 * fVar112 * fVar112 * auVar118._0_4_ * -0.5;
      auVar50._8_4_ = fVar164 * fVar164 * fVar164 * auVar118._8_4_ * -0.5;
      auVar50._12_4_ = fVar165 * fVar165 * fVar165 * auVar118._12_4_ * -0.5;
      auVar50._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar50._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar50._24_4_ = fVar168 * fVar168 * fVar168 * -0.0;
      auVar50._28_4_ = 0;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar137 = vfmadd231ps_avx512vl(auVar50,auVar138,auVar124);
      auVar51._4_4_ = auVar140._4_4_ * auVar137._4_4_;
      auVar51._0_4_ = auVar140._0_4_ * auVar137._0_4_;
      auVar51._8_4_ = auVar140._8_4_ * auVar137._8_4_;
      auVar51._12_4_ = auVar140._12_4_ * auVar137._12_4_;
      auVar51._16_4_ = auVar140._16_4_ * auVar137._16_4_;
      auVar51._20_4_ = auVar140._20_4_ * auVar137._20_4_;
      auVar51._24_4_ = auVar140._24_4_ * auVar137._24_4_;
      auVar51._28_4_ = auVar124._28_4_;
      auVar52._4_4_ = auVar137._4_4_ * -auVar139._4_4_;
      auVar52._0_4_ = auVar137._0_4_ * -auVar139._0_4_;
      auVar52._8_4_ = auVar137._8_4_ * -auVar139._8_4_;
      auVar52._12_4_ = auVar137._12_4_ * -auVar139._12_4_;
      auVar52._16_4_ = auVar137._16_4_ * -fVar186;
      auVar52._20_4_ = auVar137._20_4_ * -fVar172;
      auVar52._24_4_ = auVar137._24_4_ * -fVar187;
      auVar52._28_4_ = uVar110 ^ 0x80000000;
      auVar124 = vmulps_avx512vl(auVar137,ZEXT1632(auVar120));
      auVar128 = ZEXT1632(auVar120);
      auVar136 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar128);
      auVar118 = vfmadd231ps_fma(auVar136,auVar142,auVar142);
      auVar136 = vrsqrt14ps_avx512vl(ZEXT1632(auVar118));
      fVar172 = auVar136._0_4_;
      fVar186 = auVar136._4_4_;
      fVar187 = auVar136._8_4_;
      fVar112 = auVar136._12_4_;
      fVar196 = auVar136._16_4_;
      fVar164 = auVar136._20_4_;
      fVar165 = auVar136._24_4_;
      auVar53._4_4_ = fVar186 * fVar186 * fVar186 * auVar118._4_4_ * -0.5;
      auVar53._0_4_ = fVar172 * fVar172 * fVar172 * auVar118._0_4_ * -0.5;
      auVar53._8_4_ = fVar187 * fVar187 * fVar187 * auVar118._8_4_ * -0.5;
      auVar53._12_4_ = fVar112 * fVar112 * fVar112 * auVar118._12_4_ * -0.5;
      auVar53._16_4_ = fVar196 * fVar196 * fVar196 * -0.0;
      auVar53._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar53._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
      auVar53._28_4_ = 0;
      auVar138 = vfmadd231ps_avx512vl(auVar53,auVar138,auVar136);
      auVar54._4_4_ = auVar142._4_4_ * auVar138._4_4_;
      auVar54._0_4_ = auVar142._0_4_ * auVar138._0_4_;
      auVar54._8_4_ = auVar142._8_4_ * auVar138._8_4_;
      auVar54._12_4_ = auVar142._12_4_ * auVar138._12_4_;
      auVar54._16_4_ = auVar142._16_4_ * auVar138._16_4_;
      auVar54._20_4_ = auVar142._20_4_ * auVar138._20_4_;
      auVar54._24_4_ = auVar142._24_4_ * auVar138._24_4_;
      auVar54._28_4_ = auVar136._28_4_;
      auVar55._4_4_ = -auVar141._4_4_ * auVar138._4_4_;
      auVar55._0_4_ = -auVar141._0_4_ * auVar138._0_4_;
      auVar55._8_4_ = -auVar141._8_4_ * auVar138._8_4_;
      auVar55._12_4_ = -auVar141._12_4_ * auVar138._12_4_;
      auVar55._16_4_ = -fVar208 * auVar138._16_4_;
      auVar55._20_4_ = -fVar197 * auVar138._20_4_;
      auVar55._24_4_ = -fVar198 * auVar138._24_4_;
      auVar55._28_4_ = auVar137._28_4_;
      auVar138 = vmulps_avx512vl(auVar138,auVar128);
      auVar118 = vfmadd213ps_fma(auVar51,auVar131,auVar129);
      auVar119 = vfmadd213ps_fma(auVar52,auVar131,auVar130);
      auVar137 = vfmadd213ps_avx512vl(auVar124,auVar131,auVar135);
      auVar136 = vfmadd213ps_avx512vl(auVar54,auVar132,ZEXT1632(auVar176));
      auVar223 = vfnmadd213ps_fma(auVar51,auVar131,auVar129);
      auVar117 = vfmadd213ps_fma(auVar55,auVar132,ZEXT1632(auVar114));
      auVar199 = vfnmadd213ps_fma(auVar52,auVar131,auVar130);
      auVar116 = vfmadd213ps_fma(auVar138,auVar132,auVar127);
      auVar125 = vfnmadd231ps_avx512vl(auVar135,auVar131,auVar124);
      auVar39 = vfnmadd213ps_fma(auVar54,auVar132,ZEXT1632(auVar176));
      auVar114 = vfnmadd213ps_fma(auVar55,auVar132,ZEXT1632(auVar114));
      auVar115 = vfnmadd231ps_fma(auVar127,auVar132,auVar138);
      auVar138 = vsubps_avx512vl(auVar136,ZEXT1632(auVar223));
      auVar124 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar199));
      auVar127 = vsubps_avx512vl(ZEXT1632(auVar116),auVar125);
      auVar135 = vmulps_avx512vl(auVar124,auVar125);
      auVar176 = vfmsub231ps_fma(auVar135,ZEXT1632(auVar199),auVar127);
      auVar56._4_4_ = auVar223._4_4_ * auVar127._4_4_;
      auVar56._0_4_ = auVar223._0_4_ * auVar127._0_4_;
      auVar56._8_4_ = auVar223._8_4_ * auVar127._8_4_;
      auVar56._12_4_ = auVar223._12_4_ * auVar127._12_4_;
      auVar56._16_4_ = auVar127._16_4_ * 0.0;
      auVar56._20_4_ = auVar127._20_4_ * 0.0;
      auVar56._24_4_ = auVar127._24_4_ * 0.0;
      auVar56._28_4_ = auVar127._28_4_;
      auVar127 = vfmsub231ps_avx512vl(auVar56,auVar125,auVar138);
      auVar57._4_4_ = auVar199._4_4_ * auVar138._4_4_;
      auVar57._0_4_ = auVar199._0_4_ * auVar138._0_4_;
      auVar57._8_4_ = auVar199._8_4_ * auVar138._8_4_;
      auVar57._12_4_ = auVar199._12_4_ * auVar138._12_4_;
      auVar57._16_4_ = auVar138._16_4_ * 0.0;
      auVar57._20_4_ = auVar138._20_4_ * 0.0;
      auVar57._24_4_ = auVar138._24_4_ * 0.0;
      auVar57._28_4_ = auVar138._28_4_;
      auVar113 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar223),auVar124);
      auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar128,auVar127);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar128,ZEXT1632(auVar176));
      auVar121 = ZEXT1632(auVar120);
      uVar103 = vcmpps_avx512vl(auVar124,auVar121,2);
      bVar102 = (byte)uVar103;
      fVar112 = (float)((uint)(bVar102 & 1) * auVar118._0_4_ |
                       (uint)!(bool)(bVar102 & 1) * auVar39._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      fVar164 = (float)((uint)bVar19 * auVar118._4_4_ | (uint)!bVar19 * auVar39._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      fVar166 = (float)((uint)bVar19 * auVar118._8_4_ | (uint)!bVar19 * auVar39._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      fVar168 = (float)((uint)bVar19 * auVar118._12_4_ | (uint)!bVar19 * auVar39._12_4_);
      auVar135 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar166,CONCAT44(fVar164,fVar112))));
      fVar196 = (float)((uint)(bVar102 & 1) * auVar119._0_4_ |
                       (uint)!(bool)(bVar102 & 1) * auVar114._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      fVar165 = (float)((uint)bVar19 * auVar119._4_4_ | (uint)!bVar19 * auVar114._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      fVar167 = (float)((uint)bVar19 * auVar119._8_4_ | (uint)!bVar19 * auVar114._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      fVar169 = (float)((uint)bVar19 * auVar119._12_4_ | (uint)!bVar19 * auVar114._12_4_);
      auVar128 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar167,CONCAT44(fVar165,fVar196))));
      auVar143._0_4_ =
           (float)((uint)(bVar102 & 1) * auVar137._0_4_ |
                  (uint)!(bool)(bVar102 & 1) * auVar115._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar143._4_4_ = (float)((uint)bVar19 * auVar137._4_4_ | (uint)!bVar19 * auVar115._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar143._8_4_ = (float)((uint)bVar19 * auVar137._8_4_ | (uint)!bVar19 * auVar115._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar143._12_4_ = (float)((uint)bVar19 * auVar137._12_4_ | (uint)!bVar19 * auVar115._12_4_);
      fVar187 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar137._16_4_);
      auVar143._16_4_ = fVar187;
      fVar186 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar137._20_4_);
      auVar143._20_4_ = fVar186;
      fVar172 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar137._24_4_);
      auVar143._24_4_ = fVar172;
      iVar1 = (uint)(byte)(uVar103 >> 7) * auVar137._28_4_;
      auVar143._28_4_ = iVar1;
      auVar138 = vblendmps_avx512vl(ZEXT1632(auVar223),auVar136);
      auVar144._0_4_ =
           (uint)(bVar102 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar119._0_4_;
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar144._4_4_ = (uint)bVar19 * auVar138._4_4_ | (uint)!bVar19 * auVar119._4_4_;
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar144._8_4_ = (uint)bVar19 * auVar138._8_4_ | (uint)!bVar19 * auVar119._8_4_;
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar144._12_4_ = (uint)bVar19 * auVar138._12_4_ | (uint)!bVar19 * auVar119._12_4_;
      auVar144._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
      auVar144._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
      auVar144._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
      auVar144._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar138._28_4_;
      auVar138 = vblendmps_avx512vl(ZEXT1632(auVar199),ZEXT1632(auVar117));
      auVar145._0_4_ =
           (float)((uint)(bVar102 & 1) * auVar138._0_4_ |
                  (uint)!(bool)(bVar102 & 1) * auVar176._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar145._4_4_ = (float)((uint)bVar19 * auVar138._4_4_ | (uint)!bVar19 * auVar176._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar145._8_4_ = (float)((uint)bVar19 * auVar138._8_4_ | (uint)!bVar19 * auVar176._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar145._12_4_ = (float)((uint)bVar19 * auVar138._12_4_ | (uint)!bVar19 * auVar176._12_4_);
      fVar198 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_);
      auVar145._16_4_ = fVar198;
      fVar197 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_);
      auVar145._20_4_ = fVar197;
      fVar208 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_);
      auVar145._24_4_ = fVar208;
      auVar145._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar138._28_4_;
      auVar138 = vblendmps_avx512vl(auVar125,ZEXT1632(auVar116));
      auVar146._0_4_ =
           (float)((uint)(bVar102 & 1) * auVar138._0_4_ |
                  (uint)!(bool)(bVar102 & 1) * auVar137._0_4_);
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar146._4_4_ = (float)((uint)bVar19 * auVar138._4_4_ | (uint)!bVar19 * auVar137._4_4_);
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar146._8_4_ = (float)((uint)bVar19 * auVar138._8_4_ | (uint)!bVar19 * auVar137._8_4_);
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar146._12_4_ = (float)((uint)bVar19 * auVar138._12_4_ | (uint)!bVar19 * auVar137._12_4_);
      bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
      auVar146._16_4_ = (float)((uint)bVar19 * auVar138._16_4_ | (uint)!bVar19 * auVar137._16_4_);
      bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
      auVar146._20_4_ = (float)((uint)bVar19 * auVar138._20_4_ | (uint)!bVar19 * auVar137._20_4_);
      bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
      auVar146._24_4_ = (float)((uint)bVar19 * auVar138._24_4_ | (uint)!bVar19 * auVar137._24_4_);
      bVar19 = SUB81(uVar103 >> 7,0);
      auVar146._28_4_ = (uint)bVar19 * auVar138._28_4_ | (uint)!bVar19 * auVar137._28_4_;
      auVar147._0_4_ =
           (uint)(bVar102 & 1) * (int)auVar223._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar136._0_4_;
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar147._4_4_ = (uint)bVar19 * (int)auVar223._4_4_ | (uint)!bVar19 * auVar136._4_4_;
      bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar147._8_4_ = (uint)bVar19 * (int)auVar223._8_4_ | (uint)!bVar19 * auVar136._8_4_;
      bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar147._12_4_ = (uint)bVar19 * (int)auVar223._12_4_ | (uint)!bVar19 * auVar136._12_4_;
      auVar147._16_4_ = (uint)!(bool)((byte)(uVar103 >> 4) & 1) * auVar136._16_4_;
      auVar147._20_4_ = (uint)!(bool)((byte)(uVar103 >> 5) & 1) * auVar136._20_4_;
      auVar147._24_4_ = (uint)!(bool)((byte)(uVar103 >> 6) & 1) * auVar136._24_4_;
      auVar147._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar136._28_4_;
      bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
      bVar21 = (bool)((byte)(uVar103 >> 2) & 1);
      bVar22 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar148._0_4_ =
           (uint)(bVar102 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar116._0_4_;
      bVar20 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar20 * auVar125._4_4_ | (uint)!bVar20 * auVar116._4_4_;
      bVar20 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar20 * auVar125._8_4_ | (uint)!bVar20 * auVar116._8_4_;
      bVar20 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar20 * auVar125._12_4_ | (uint)!bVar20 * auVar116._12_4_;
      auVar148._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar125._16_4_;
      auVar148._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar125._20_4_;
      auVar148._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar125._24_4_;
      iVar2 = (uint)(byte)(uVar103 >> 7) * auVar125._28_4_;
      auVar148._28_4_ = iVar2;
      auVar129 = vsubps_avx512vl(auVar147,auVar135);
      auVar138 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar199._12_4_ |
                                               (uint)!bVar22 * auVar117._12_4_,
                                               CONCAT48((uint)bVar21 * (int)auVar199._8_4_ |
                                                        (uint)!bVar21 * auVar117._8_4_,
                                                        CONCAT44((uint)bVar19 * (int)auVar199._4_4_
                                                                 | (uint)!bVar19 * auVar117._4_4_,
                                                                 (uint)(bVar102 & 1) *
                                                                 (int)auVar199._0_4_ |
                                                                 (uint)!(bool)(bVar102 & 1) *
                                                                 auVar117._0_4_)))),auVar128);
      auVar220 = ZEXT3264(auVar138);
      auVar137 = vsubps_avx(auVar148,auVar143);
      auVar136 = vsubps_avx(auVar135,auVar144);
      auVar222 = ZEXT3264(auVar136);
      auVar125 = vsubps_avx(auVar128,auVar145);
      auVar127 = vsubps_avx(auVar143,auVar146);
      auVar58._4_4_ = auVar137._4_4_ * fVar164;
      auVar58._0_4_ = auVar137._0_4_ * fVar112;
      auVar58._8_4_ = auVar137._8_4_ * fVar166;
      auVar58._12_4_ = auVar137._12_4_ * fVar168;
      auVar58._16_4_ = auVar137._16_4_ * 0.0;
      auVar58._20_4_ = auVar137._20_4_ * 0.0;
      auVar58._24_4_ = auVar137._24_4_ * 0.0;
      auVar58._28_4_ = iVar2;
      auVar118 = vfmsub231ps_fma(auVar58,auVar143,auVar129);
      auVar59._4_4_ = fVar165 * auVar129._4_4_;
      auVar59._0_4_ = fVar196 * auVar129._0_4_;
      auVar59._8_4_ = fVar167 * auVar129._8_4_;
      auVar59._12_4_ = fVar169 * auVar129._12_4_;
      auVar59._16_4_ = auVar129._16_4_ * 0.0;
      auVar59._20_4_ = auVar129._20_4_ * 0.0;
      auVar59._24_4_ = auVar129._24_4_ * 0.0;
      auVar59._28_4_ = auVar124._28_4_;
      auVar119 = vfmsub231ps_fma(auVar59,auVar135,auVar138);
      auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar121,ZEXT1632(auVar118));
      auVar210._0_4_ = auVar138._0_4_ * auVar143._0_4_;
      auVar210._4_4_ = auVar138._4_4_ * auVar143._4_4_;
      auVar210._8_4_ = auVar138._8_4_ * auVar143._8_4_;
      auVar210._12_4_ = auVar138._12_4_ * auVar143._12_4_;
      auVar210._16_4_ = auVar138._16_4_ * fVar187;
      auVar210._20_4_ = auVar138._20_4_ * fVar186;
      auVar210._24_4_ = auVar138._24_4_ * fVar172;
      auVar210._28_4_ = 0;
      auVar118 = vfmsub231ps_fma(auVar210,auVar128,auVar137);
      auVar130 = vfmadd231ps_avx512vl(auVar124,auVar121,ZEXT1632(auVar118));
      auVar124 = vmulps_avx512vl(auVar127,auVar144);
      auVar124 = vfmsub231ps_avx512vl(auVar124,auVar136,auVar146);
      auVar60._4_4_ = auVar125._4_4_ * auVar146._4_4_;
      auVar60._0_4_ = auVar125._0_4_ * auVar146._0_4_;
      auVar60._8_4_ = auVar125._8_4_ * auVar146._8_4_;
      auVar60._12_4_ = auVar125._12_4_ * auVar146._12_4_;
      auVar60._16_4_ = auVar125._16_4_ * auVar146._16_4_;
      auVar60._20_4_ = auVar125._20_4_ * auVar146._20_4_;
      auVar60._24_4_ = auVar125._24_4_ * auVar146._24_4_;
      auVar60._28_4_ = auVar146._28_4_;
      auVar118 = vfmsub231ps_fma(auVar60,auVar145,auVar127);
      auVar211._0_4_ = auVar145._0_4_ * auVar136._0_4_;
      auVar211._4_4_ = auVar145._4_4_ * auVar136._4_4_;
      auVar211._8_4_ = auVar145._8_4_ * auVar136._8_4_;
      auVar211._12_4_ = auVar145._12_4_ * auVar136._12_4_;
      auVar211._16_4_ = fVar198 * auVar136._16_4_;
      auVar211._20_4_ = fVar197 * auVar136._20_4_;
      auVar211._24_4_ = fVar208 * auVar136._24_4_;
      auVar211._28_4_ = 0;
      auVar119 = vfmsub231ps_fma(auVar211,auVar125,auVar144);
      auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar121,auVar124);
      auVar123 = vfmadd231ps_avx512vl(auVar124,auVar121,ZEXT1632(auVar118));
      auVar214 = ZEXT3264(auVar123);
      auVar124 = vmaxps_avx(auVar130,auVar123);
      uVar35 = vcmpps_avx512vl(auVar124,auVar121,2);
      bVar111 = bVar111 & (byte)uVar35;
      if (bVar111 != 0) {
        auVar61._4_4_ = auVar127._4_4_ * auVar138._4_4_;
        auVar61._0_4_ = auVar127._0_4_ * auVar138._0_4_;
        auVar61._8_4_ = auVar127._8_4_ * auVar138._8_4_;
        auVar61._12_4_ = auVar127._12_4_ * auVar138._12_4_;
        auVar61._16_4_ = auVar127._16_4_ * auVar138._16_4_;
        auVar61._20_4_ = auVar127._20_4_ * auVar138._20_4_;
        auVar61._24_4_ = auVar127._24_4_ * auVar138._24_4_;
        auVar61._28_4_ = auVar124._28_4_;
        auVar176 = vfmsub231ps_fma(auVar61,auVar125,auVar137);
        auVar62._4_4_ = auVar137._4_4_ * auVar136._4_4_;
        auVar62._0_4_ = auVar137._0_4_ * auVar136._0_4_;
        auVar62._8_4_ = auVar137._8_4_ * auVar136._8_4_;
        auVar62._12_4_ = auVar137._12_4_ * auVar136._12_4_;
        auVar62._16_4_ = auVar137._16_4_ * auVar136._16_4_;
        auVar62._20_4_ = auVar137._20_4_ * auVar136._20_4_;
        auVar62._24_4_ = auVar137._24_4_ * auVar136._24_4_;
        auVar62._28_4_ = auVar137._28_4_;
        auVar117 = vfmsub231ps_fma(auVar62,auVar129,auVar127);
        auVar63._4_4_ = auVar125._4_4_ * auVar129._4_4_;
        auVar63._0_4_ = auVar125._0_4_ * auVar129._0_4_;
        auVar63._8_4_ = auVar125._8_4_ * auVar129._8_4_;
        auVar63._12_4_ = auVar125._12_4_ * auVar129._12_4_;
        auVar63._16_4_ = auVar125._16_4_ * auVar129._16_4_;
        auVar63._20_4_ = auVar125._20_4_ * auVar129._20_4_;
        auVar63._24_4_ = auVar125._24_4_ * auVar129._24_4_;
        auVar63._28_4_ = auVar125._28_4_;
        auVar116 = vfmsub231ps_fma(auVar63,auVar136,auVar138);
        auVar118 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar117),ZEXT1632(auVar116));
        auVar119 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar176),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar124 = vrcp14ps_avx512vl(ZEXT1632(auVar119));
        auVar222 = ZEXT3264(auVar124);
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar40._16_4_ = 0x3f800000;
        auVar40._20_4_ = 0x3f800000;
        auVar40._24_4_ = 0x3f800000;
        auVar40._28_4_ = 0x3f800000;
        auVar138 = vfnmadd213ps_avx512vl(auVar124,ZEXT1632(auVar119),auVar40);
        auVar118 = vfmadd132ps_fma(auVar138,auVar124,auVar124);
        auVar220 = ZEXT1664(auVar118);
        auVar64._4_4_ = auVar116._4_4_ * auVar143._4_4_;
        auVar64._0_4_ = auVar116._0_4_ * auVar143._0_4_;
        auVar64._8_4_ = auVar116._8_4_ * auVar143._8_4_;
        auVar64._12_4_ = auVar116._12_4_ * auVar143._12_4_;
        auVar64._16_4_ = fVar187 * 0.0;
        auVar64._20_4_ = fVar186 * 0.0;
        auVar64._24_4_ = fVar172 * 0.0;
        auVar64._28_4_ = iVar1;
        auVar117 = vfmadd231ps_fma(auVar64,auVar128,ZEXT1632(auVar117));
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar135,ZEXT1632(auVar176));
        fVar172 = auVar118._0_4_;
        fVar186 = auVar118._4_4_;
        fVar187 = auVar118._8_4_;
        fVar198 = auVar118._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar117._12_4_ * fVar198,
                                       CONCAT48(auVar117._8_4_ * fVar187,
                                                CONCAT44(auVar117._4_4_ * fVar186,
                                                         auVar117._0_4_ * fVar172))));
        auVar225 = ZEXT3264(local_560);
        auVar177._4_4_ = local_720;
        auVar177._0_4_ = local_720;
        auVar177._8_4_ = local_720;
        auVar177._12_4_ = local_720;
        auVar177._16_4_ = local_720;
        auVar177._20_4_ = local_720;
        auVar177._24_4_ = local_720;
        auVar177._28_4_ = local_720;
        uVar35 = vcmpps_avx512vl(auVar177,local_560,2);
        uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar41._4_4_ = uVar173;
        auVar41._0_4_ = uVar173;
        auVar41._8_4_ = uVar173;
        auVar41._12_4_ = uVar173;
        auVar41._16_4_ = uVar173;
        auVar41._20_4_ = uVar173;
        auVar41._24_4_ = uVar173;
        auVar41._28_4_ = uVar173;
        uVar36 = vcmpps_avx512vl(local_560,auVar41,2);
        bVar111 = (byte)uVar35 & (byte)uVar36 & bVar111;
        if (bVar111 != 0) {
          uVar109 = vcmpps_avx512vl(ZEXT1632(auVar119),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar109 = bVar111 & uVar109;
          if ((char)uVar109 != '\0') {
            fVar197 = auVar130._0_4_ * fVar172;
            fVar208 = auVar130._4_4_ * fVar186;
            auVar65._4_4_ = fVar208;
            auVar65._0_4_ = fVar197;
            fVar112 = auVar130._8_4_ * fVar187;
            auVar65._8_4_ = fVar112;
            fVar196 = auVar130._12_4_ * fVar198;
            auVar65._12_4_ = fVar196;
            fVar164 = auVar130._16_4_ * 0.0;
            auVar65._16_4_ = fVar164;
            fVar165 = auVar130._20_4_ * 0.0;
            auVar65._20_4_ = fVar165;
            fVar166 = auVar130._24_4_ * 0.0;
            auVar65._24_4_ = fVar166;
            auVar65._28_4_ = auVar130._28_4_;
            auVar178._8_4_ = 0x3f800000;
            auVar178._0_8_ = 0x3f8000003f800000;
            auVar178._12_4_ = 0x3f800000;
            auVar178._16_4_ = 0x3f800000;
            auVar178._20_4_ = 0x3f800000;
            auVar178._24_4_ = 0x3f800000;
            auVar178._28_4_ = 0x3f800000;
            auVar124 = vsubps_avx(auVar178,auVar65);
            local_5a0._0_4_ =
                 (float)((uint)(bVar102 & 1) * (int)fVar197 |
                        (uint)!(bool)(bVar102 & 1) * auVar124._0_4_);
            bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
            local_5a0._4_4_ = (float)((uint)bVar19 * (int)fVar208 | (uint)!bVar19 * auVar124._4_4_);
            bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
            local_5a0._8_4_ = (float)((uint)bVar19 * (int)fVar112 | (uint)!bVar19 * auVar124._8_4_);
            bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
            local_5a0._12_4_ =
                 (float)((uint)bVar19 * (int)fVar196 | (uint)!bVar19 * auVar124._12_4_);
            bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
            local_5a0._16_4_ =
                 (float)((uint)bVar19 * (int)fVar164 | (uint)!bVar19 * auVar124._16_4_);
            bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
            local_5a0._20_4_ =
                 (float)((uint)bVar19 * (int)fVar165 | (uint)!bVar19 * auVar124._20_4_);
            bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
            local_5a0._24_4_ =
                 (float)((uint)bVar19 * (int)fVar166 | (uint)!bVar19 * auVar124._24_4_);
            bVar19 = SUB81(uVar103 >> 7,0);
            local_5a0._28_4_ =
                 (float)((uint)bVar19 * auVar130._28_4_ | (uint)!bVar19 * auVar124._28_4_);
            auVar124 = vsubps_avx(auVar132,auVar131);
            auVar118 = vfmadd213ps_fma(auVar124,local_5a0,auVar131);
            uVar173 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar42._4_4_ = uVar173;
            auVar42._0_4_ = uVar173;
            auVar42._8_4_ = uVar173;
            auVar42._12_4_ = uVar173;
            auVar42._16_4_ = uVar173;
            auVar42._20_4_ = uVar173;
            auVar42._24_4_ = uVar173;
            auVar42._28_4_ = uVar173;
            auVar124 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar118._12_4_ + auVar118._12_4_,
                                                          CONCAT48(auVar118._8_4_ + auVar118._8_4_,
                                                                   CONCAT44(auVar118._4_4_ +
                                                                            auVar118._4_4_,
                                                                            auVar118._0_4_ +
                                                                            auVar118._0_4_)))),
                                       auVar42);
            uVar37 = vcmpps_avx512vl(local_560,auVar124,6);
            uVar109 = uVar109 & uVar37;
            bVar111 = (byte)uVar109;
            if (bVar111 != 0) {
              auVar194._0_4_ = auVar123._0_4_ * fVar172;
              auVar194._4_4_ = auVar123._4_4_ * fVar186;
              auVar194._8_4_ = auVar123._8_4_ * fVar187;
              auVar194._12_4_ = auVar123._12_4_ * fVar198;
              auVar194._16_4_ = auVar123._16_4_ * 0.0;
              auVar194._20_4_ = auVar123._20_4_ * 0.0;
              auVar194._24_4_ = auVar123._24_4_ * 0.0;
              auVar194._28_4_ = 0;
              auVar205._8_4_ = 0x3f800000;
              auVar205._0_8_ = 0x3f8000003f800000;
              auVar205._12_4_ = 0x3f800000;
              auVar205._16_4_ = 0x3f800000;
              auVar205._20_4_ = 0x3f800000;
              auVar205._24_4_ = 0x3f800000;
              auVar205._28_4_ = 0x3f800000;
              auVar124 = vsubps_avx(auVar205,auVar194);
              auVar149._0_4_ =
                   (uint)(bVar102 & 1) * (int)auVar194._0_4_ |
                   (uint)!(bool)(bVar102 & 1) * auVar124._0_4_;
              bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
              auVar149._4_4_ = (uint)bVar19 * (int)auVar194._4_4_ | (uint)!bVar19 * auVar124._4_4_;
              bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
              auVar149._8_4_ = (uint)bVar19 * (int)auVar194._8_4_ | (uint)!bVar19 * auVar124._8_4_;
              bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
              auVar149._12_4_ =
                   (uint)bVar19 * (int)auVar194._12_4_ | (uint)!bVar19 * auVar124._12_4_;
              bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
              auVar149._16_4_ =
                   (uint)bVar19 * (int)auVar194._16_4_ | (uint)!bVar19 * auVar124._16_4_;
              bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
              auVar149._20_4_ =
                   (uint)bVar19 * (int)auVar194._20_4_ | (uint)!bVar19 * auVar124._20_4_;
              bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
              auVar149._24_4_ =
                   (uint)bVar19 * (int)auVar194._24_4_ | (uint)!bVar19 * auVar124._24_4_;
              auVar149._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar124._28_4_;
              auVar43._8_4_ = 0x40000000;
              auVar43._0_8_ = 0x4000000040000000;
              auVar43._12_4_ = 0x40000000;
              auVar43._16_4_ = 0x40000000;
              auVar43._20_4_ = 0x40000000;
              auVar43._24_4_ = 0x40000000;
              auVar43._28_4_ = 0x40000000;
              local_580 = vfmsub132ps_avx512vl(auVar149,auVar205,auVar43);
              local_540 = 0;
              auVar222 = ZEXT1664(auVar33);
              if ((pGVar106->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar189 = 1.0 / auVar229._0_4_;
                local_4e0[0] = fVar189 * (local_5a0._0_4_ + 0.0);
                local_4e0[1] = fVar189 * (local_5a0._4_4_ + 1.0);
                local_4e0[2] = fVar189 * (local_5a0._8_4_ + 2.0);
                local_4e0[3] = fVar189 * (local_5a0._12_4_ + 3.0);
                fStack_4d0 = fVar189 * (local_5a0._16_4_ + 4.0);
                fStack_4cc = fVar189 * (local_5a0._20_4_ + 5.0);
                fStack_4c8 = fVar189 * (local_5a0._24_4_ + 6.0);
                fStack_4c4 = local_5a0._28_4_ + 7.0;
                local_4c0 = local_580;
                local_4a0 = local_560;
                auVar179._8_4_ = 0x7f800000;
                auVar179._0_8_ = 0x7f8000007f800000;
                auVar179._12_4_ = 0x7f800000;
                auVar179._16_4_ = 0x7f800000;
                auVar179._20_4_ = 0x7f800000;
                auVar179._24_4_ = 0x7f800000;
                auVar179._28_4_ = 0x7f800000;
                auVar124 = vblendmps_avx512vl(auVar179,local_560);
                auVar150._0_4_ =
                     (uint)(bVar111 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 1) & 1);
                auVar150._4_4_ = (uint)bVar19 * auVar124._4_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 2) & 1);
                auVar150._8_4_ = (uint)bVar19 * auVar124._8_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                auVar150._12_4_ = (uint)bVar19 * auVar124._12_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 4) & 1);
                auVar150._16_4_ = (uint)bVar19 * auVar124._16_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 5) & 1);
                auVar150._20_4_ = (uint)bVar19 * auVar124._20_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)((byte)(uVar109 >> 6) & 1);
                auVar150._24_4_ = (uint)bVar19 * auVar124._24_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = SUB81(uVar109 >> 7,0);
                auVar150._28_4_ = (uint)bVar19 * auVar124._28_4_ | (uint)!bVar19 * 0x7f800000;
                auVar124 = vshufps_avx(auVar150,auVar150,0xb1);
                auVar124 = vminps_avx(auVar150,auVar124);
                auVar138 = vshufpd_avx(auVar124,auVar124,5);
                auVar124 = vminps_avx(auVar124,auVar138);
                auVar138 = vpermpd_avx2(auVar124,0x4e);
                auVar124 = vminps_avx(auVar124,auVar138);
                uVar35 = vcmpps_avx512vl(auVar150,auVar124,0);
                uVar110 = (uint)uVar109;
                if ((bVar111 & (byte)uVar35) != 0) {
                  uVar110 = (uint)(bVar111 & (byte)uVar35);
                }
                uVar104 = 0;
                for (; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x80000000) {
                  uVar104 = uVar104 + 1;
                }
                uVar103 = (ulong)uVar104;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_740 = *(float *)(ray + k * 4 + 0x200);
                  fStack_73c = 0.0;
                  fStack_738 = 0.0;
                  fStack_734 = 0.0;
                  local_7e0 = auVar126;
                  local_7c0 = local_560;
                  local_53c = iVar16;
                  local_530 = auVar33;
                  local_520 = uVar34;
                  uStack_518 = uVar38;
                  local_510 = uVar96;
                  uStack_508 = uVar97;
                  local_500 = uVar98;
                  uStack_4f8 = uVar99;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar103]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar103 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar103 * 4);
                    local_830.context = context->user;
                    fVar187 = local_200._0_4_;
                    fVar172 = 1.0 - fVar187;
                    fVar189 = fVar172 * fVar172 * -3.0;
                    auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * fVar172)),
                                               ZEXT416((uint)(fVar187 * fVar172)),
                                               ZEXT416(0xc0000000));
                    auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar172)),
                                               ZEXT416((uint)(fVar187 * fVar187)),
                                               ZEXT416(0x40000000));
                    fVar172 = auVar118._0_4_ * 3.0;
                    fVar186 = auVar119._0_4_ * 3.0;
                    fVar187 = fVar187 * fVar187 * 3.0;
                    auVar218._0_4_ = fVar187 * local_890;
                    auVar218._4_4_ = fVar187 * fStack_88c;
                    auVar218._8_4_ = fVar187 * fStack_888;
                    auVar218._12_4_ = fVar187 * fStack_884;
                    auVar117._4_4_ = fVar186;
                    auVar117._0_4_ = fVar186;
                    auVar117._8_4_ = fVar186;
                    auVar117._12_4_ = fVar186;
                    auVar118 = vfmadd132ps_fma(auVar117,auVar218,auVar8);
                    auVar116._4_4_ = fVar172;
                    auVar116._0_4_ = fVar172;
                    auVar116._8_4_ = fVar172;
                    auVar116._12_4_ = fVar172;
                    auVar118 = vfmadd132ps_fma(auVar116,auVar118,auVar9);
                    auVar176._4_4_ = fVar189;
                    auVar176._0_4_ = fVar189;
                    auVar176._8_4_ = fVar189;
                    auVar176._12_4_ = fVar189;
                    auVar118 = vfmadd213ps_fma(auVar176,auVar33,auVar118);
                    auVar222 = vbroadcastss_avx512f(auVar118);
                    auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar118));
                    auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar118));
                    local_2c0[0] = (RTCHitN)auVar222[0];
                    local_2c0[1] = (RTCHitN)auVar222[1];
                    local_2c0[2] = (RTCHitN)auVar222[2];
                    local_2c0[3] = (RTCHitN)auVar222[3];
                    local_2c0[4] = (RTCHitN)auVar222[4];
                    local_2c0[5] = (RTCHitN)auVar222[5];
                    local_2c0[6] = (RTCHitN)auVar222[6];
                    local_2c0[7] = (RTCHitN)auVar222[7];
                    local_2c0[8] = (RTCHitN)auVar222[8];
                    local_2c0[9] = (RTCHitN)auVar222[9];
                    local_2c0[10] = (RTCHitN)auVar222[10];
                    local_2c0[0xb] = (RTCHitN)auVar222[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar222[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar222[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar222[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar222[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar222[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar222[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar222[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar222[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar222[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar222[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar222[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar222[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar222[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar222[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar222[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar222[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar222[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar222[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar222[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar222[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar222[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar222[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar222[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar222[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar222[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar222[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar222[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar222[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar222[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar222[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar222[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar222[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar222[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar222[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar222[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar222[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar222[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar222[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar222[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar222[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar222[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar222[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar222[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar222[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar222[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar222[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar222[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar222[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar222[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar222[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar222[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar222[0x3f];
                    local_280 = auVar214;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar222 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar222);
                    auVar126 = vpcmpeqd_avx2(auVar222._0_32_,auVar222._0_32_);
                    local_7f0[3] = auVar126;
                    local_7f0[2] = auVar126;
                    local_7f0[1] = auVar126;
                    *local_7f0 = auVar126;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                    auVar222 = vmovdqa64_avx512f(local_380);
                    local_700 = vmovdqa64_avx512f(auVar222);
                    local_830.valid = (int *)local_700;
                    local_830.geometryUserPtr = pGVar106->userPtr;
                    local_830.hit = local_2c0;
                    local_830.N = 0x10;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar214 = ZEXT1664(auVar214._0_16_);
                      auVar220 = ZEXT1664(auVar220._0_16_);
                      (*pGVar106->intersectionFilterN)(&local_830);
                      auVar225 = ZEXT3264(local_7c0);
                      auVar185 = ZEXT3264(local_7e0);
                      auVar238 = ZEXT3264(local_780);
                      auVar237 = ZEXT3264(local_760);
                      auVar222 = vmovdqa64_avx512f(local_700);
                    }
                    uVar35 = vptestmd_avx512f(auVar222,auVar222);
                    if ((short)uVar35 == 0) {
LAB_01a91163:
                      *(float *)(ray + k * 4 + 0x200) = local_740;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar106->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar220 = ZEXT1664(auVar220._0_16_);
                        (*p_Var18)(&local_830);
                        auVar225 = ZEXT3264(local_7c0);
                        auVar185 = ZEXT3264(local_7e0);
                        auVar238 = ZEXT3264(local_780);
                        auVar237 = ZEXT3264(local_760);
                        auVar222 = vmovdqa64_avx512f(local_700);
                      }
                      uVar37 = vptestmd_avx512f(auVar222,auVar222);
                      if ((short)uVar37 == 0) goto LAB_01a91163;
                      iVar1 = *(int *)(local_830.hit + 4);
                      iVar2 = *(int *)(local_830.hit + 8);
                      iVar83 = *(int *)(local_830.hit + 0xc);
                      iVar84 = *(int *)(local_830.hit + 0x10);
                      iVar85 = *(int *)(local_830.hit + 0x14);
                      iVar86 = *(int *)(local_830.hit + 0x18);
                      iVar87 = *(int *)(local_830.hit + 0x1c);
                      iVar88 = *(int *)(local_830.hit + 0x20);
                      iVar89 = *(int *)(local_830.hit + 0x24);
                      iVar90 = *(int *)(local_830.hit + 0x28);
                      iVar91 = *(int *)(local_830.hit + 0x2c);
                      iVar92 = *(int *)(local_830.hit + 0x30);
                      iVar93 = *(int *)(local_830.hit + 0x34);
                      iVar94 = *(int *)(local_830.hit + 0x38);
                      iVar95 = *(int *)(local_830.hit + 0x3c);
                      bVar111 = (byte)uVar37;
                      bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar102 = (byte)(uVar37 >> 8);
                      bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                      bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                      bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                      bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                      bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                      bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                      bVar32 = SUB81(uVar37 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x300) =
                           (uint)(bVar111 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x300);
                      *(uint *)(local_830.ray + 0x304) =
                           (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 0x304);
                      *(uint *)(local_830.ray + 0x308) =
                           (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_830.ray + 0x308);
                      *(uint *)(local_830.ray + 0x30c) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_830.ray + 0x30c);
                      *(uint *)(local_830.ray + 0x310) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x310);
                      *(uint *)(local_830.ray + 0x314) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x314);
                      *(uint *)(local_830.ray + 0x318) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x318);
                      *(uint *)(local_830.ray + 0x31c) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x31c);
                      *(uint *)(local_830.ray + 800) =
                           (uint)(bVar102 & 1) * iVar88 |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 800);
                      *(uint *)(local_830.ray + 0x324) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_830.ray + 0x324);
                      *(uint *)(local_830.ray + 0x328) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_830.ray + 0x328);
                      *(uint *)(local_830.ray + 0x32c) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_830.ray + 0x32c);
                      *(uint *)(local_830.ray + 0x330) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_830.ray + 0x330);
                      *(uint *)(local_830.ray + 0x334) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_830.ray + 0x334);
                      *(uint *)(local_830.ray + 0x338) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_830.ray + 0x338);
                      *(uint *)(local_830.ray + 0x33c) =
                           (uint)bVar32 * iVar95 | (uint)!bVar32 * *(int *)(local_830.ray + 0x33c);
                      iVar1 = *(int *)(local_830.hit + 0x44);
                      iVar2 = *(int *)(local_830.hit + 0x48);
                      iVar83 = *(int *)(local_830.hit + 0x4c);
                      iVar84 = *(int *)(local_830.hit + 0x50);
                      iVar85 = *(int *)(local_830.hit + 0x54);
                      iVar86 = *(int *)(local_830.hit + 0x58);
                      iVar87 = *(int *)(local_830.hit + 0x5c);
                      iVar88 = *(int *)(local_830.hit + 0x60);
                      iVar89 = *(int *)(local_830.hit + 100);
                      iVar90 = *(int *)(local_830.hit + 0x68);
                      iVar91 = *(int *)(local_830.hit + 0x6c);
                      iVar92 = *(int *)(local_830.hit + 0x70);
                      iVar93 = *(int *)(local_830.hit + 0x74);
                      iVar94 = *(int *)(local_830.hit + 0x78);
                      iVar95 = *(int *)(local_830.hit + 0x7c);
                      bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                      bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                      bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                      bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                      bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                      bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                      bVar32 = SUB81(uVar37 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x340) =
                           (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x340);
                      *(uint *)(local_830.ray + 0x344) =
                           (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 0x344);
                      *(uint *)(local_830.ray + 0x348) =
                           (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_830.ray + 0x348);
                      *(uint *)(local_830.ray + 0x34c) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_830.ray + 0x34c);
                      *(uint *)(local_830.ray + 0x350) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x350);
                      *(uint *)(local_830.ray + 0x354) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x354);
                      *(uint *)(local_830.ray + 0x358) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x358);
                      *(uint *)(local_830.ray + 0x35c) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x35c);
                      *(uint *)(local_830.ray + 0x360) =
                           (uint)(bVar102 & 1) * iVar88 |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x360);
                      *(uint *)(local_830.ray + 0x364) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_830.ray + 0x364);
                      *(uint *)(local_830.ray + 0x368) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_830.ray + 0x368);
                      *(uint *)(local_830.ray + 0x36c) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_830.ray + 0x36c);
                      *(uint *)(local_830.ray + 0x370) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_830.ray + 0x370);
                      *(uint *)(local_830.ray + 0x374) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_830.ray + 0x374);
                      *(uint *)(local_830.ray + 0x378) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_830.ray + 0x378);
                      *(uint *)(local_830.ray + 0x37c) =
                           (uint)bVar32 * iVar95 | (uint)!bVar32 * *(int *)(local_830.ray + 0x37c);
                      iVar1 = *(int *)(local_830.hit + 0x84);
                      iVar2 = *(int *)(local_830.hit + 0x88);
                      iVar83 = *(int *)(local_830.hit + 0x8c);
                      iVar84 = *(int *)(local_830.hit + 0x90);
                      iVar85 = *(int *)(local_830.hit + 0x94);
                      iVar86 = *(int *)(local_830.hit + 0x98);
                      iVar87 = *(int *)(local_830.hit + 0x9c);
                      iVar88 = *(int *)(local_830.hit + 0xa0);
                      iVar89 = *(int *)(local_830.hit + 0xa4);
                      iVar90 = *(int *)(local_830.hit + 0xa8);
                      iVar91 = *(int *)(local_830.hit + 0xac);
                      iVar92 = *(int *)(local_830.hit + 0xb0);
                      iVar93 = *(int *)(local_830.hit + 0xb4);
                      iVar94 = *(int *)(local_830.hit + 0xb8);
                      iVar95 = *(int *)(local_830.hit + 0xbc);
                      bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                      bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                      bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                      bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                      bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                      bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                      bVar32 = SUB81(uVar37 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x380) =
                           (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x80) |
                           (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x380);
                      *(uint *)(local_830.ray + 900) =
                           (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 900);
                      *(uint *)(local_830.ray + 0x388) =
                           (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_830.ray + 0x388);
                      *(uint *)(local_830.ray + 0x38c) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_830.ray + 0x38c);
                      *(uint *)(local_830.ray + 0x390) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x390);
                      *(uint *)(local_830.ray + 0x394) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x394);
                      *(uint *)(local_830.ray + 0x398) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x398);
                      *(uint *)(local_830.ray + 0x39c) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x39c);
                      *(uint *)(local_830.ray + 0x3a0) =
                           (uint)(bVar102 & 1) * iVar88 |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x3a0);
                      *(uint *)(local_830.ray + 0x3a4) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3a4);
                      *(uint *)(local_830.ray + 0x3a8) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3a8);
                      *(uint *)(local_830.ray + 0x3ac) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3ac);
                      *(uint *)(local_830.ray + 0x3b0) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_830.ray + 0x3b0);
                      *(uint *)(local_830.ray + 0x3b4) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_830.ray + 0x3b4);
                      *(uint *)(local_830.ray + 0x3b8) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_830.ray + 0x3b8);
                      *(uint *)(local_830.ray + 0x3bc) =
                           (uint)bVar32 * iVar95 | (uint)!bVar32 * *(int *)(local_830.ray + 0x3bc);
                      iVar1 = *(int *)(local_830.hit + 0xc4);
                      iVar2 = *(int *)(local_830.hit + 200);
                      iVar83 = *(int *)(local_830.hit + 0xcc);
                      iVar84 = *(int *)(local_830.hit + 0xd0);
                      iVar85 = *(int *)(local_830.hit + 0xd4);
                      iVar86 = *(int *)(local_830.hit + 0xd8);
                      iVar87 = *(int *)(local_830.hit + 0xdc);
                      iVar88 = *(int *)(local_830.hit + 0xe0);
                      iVar89 = *(int *)(local_830.hit + 0xe4);
                      iVar90 = *(int *)(local_830.hit + 0xe8);
                      iVar91 = *(int *)(local_830.hit + 0xec);
                      iVar92 = *(int *)(local_830.hit + 0xf0);
                      iVar93 = *(int *)(local_830.hit + 0xf4);
                      iVar94 = *(int *)(local_830.hit + 0xf8);
                      iVar95 = *(int *)(local_830.hit + 0xfc);
                      bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                      bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                      bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                      bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                      bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                      bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                      bVar32 = SUB81(uVar37 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x3c0) =
                           (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0xc0) |
                           (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x3c0);
                      *(uint *)(local_830.ray + 0x3c4) =
                           (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3c4);
                      *(uint *)(local_830.ray + 0x3c8) =
                           (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3c8);
                      *(uint *)(local_830.ray + 0x3cc) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3cc);
                      *(uint *)(local_830.ray + 0x3d0) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3d0);
                      *(uint *)(local_830.ray + 0x3d4) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3d4);
                      *(uint *)(local_830.ray + 0x3d8) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3d8);
                      *(uint *)(local_830.ray + 0x3dc) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3dc);
                      *(uint *)(local_830.ray + 0x3e0) =
                           (uint)(bVar102 & 1) * iVar88 |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x3e0);
                      *(uint *)(local_830.ray + 0x3e4) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3e4);
                      *(uint *)(local_830.ray + 1000) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_830.ray + 1000);
                      *(uint *)(local_830.ray + 0x3ec) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3ec);
                      *(uint *)(local_830.ray + 0x3f0) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_830.ray + 0x3f0);
                      *(uint *)(local_830.ray + 0x3f4) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_830.ray + 0x3f4);
                      *(uint *)(local_830.ray + 0x3f8) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_830.ray + 0x3f8);
                      *(uint *)(local_830.ray + 0x3fc) =
                           (uint)bVar32 * iVar95 | (uint)!bVar32 * *(int *)(local_830.ray + 0x3fc);
                      iVar1 = *(int *)(local_830.hit + 0x104);
                      iVar2 = *(int *)(local_830.hit + 0x108);
                      iVar83 = *(int *)(local_830.hit + 0x10c);
                      iVar84 = *(int *)(local_830.hit + 0x110);
                      iVar85 = *(int *)(local_830.hit + 0x114);
                      iVar86 = *(int *)(local_830.hit + 0x118);
                      iVar87 = *(int *)(local_830.hit + 0x11c);
                      iVar88 = *(int *)(local_830.hit + 0x120);
                      iVar89 = *(int *)(local_830.hit + 0x124);
                      iVar90 = *(int *)(local_830.hit + 0x128);
                      iVar91 = *(int *)(local_830.hit + 300);
                      iVar92 = *(int *)(local_830.hit + 0x130);
                      iVar93 = *(int *)(local_830.hit + 0x134);
                      iVar94 = *(int *)(local_830.hit + 0x138);
                      iVar95 = *(int *)(local_830.hit + 0x13c);
                      bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                      bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                      bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                      bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                      bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                      bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                      bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                      bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                      bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                      bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                      bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                      bVar32 = SUB81(uVar37 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x400) =
                           (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x100) |
                           (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x400);
                      *(uint *)(local_830.ray + 0x404) =
                           (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 0x404);
                      *(uint *)(local_830.ray + 0x408) =
                           (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_830.ray + 0x408);
                      *(uint *)(local_830.ray + 0x40c) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_830.ray + 0x40c);
                      *(uint *)(local_830.ray + 0x410) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x410);
                      *(uint *)(local_830.ray + 0x414) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x414);
                      *(uint *)(local_830.ray + 0x418) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x418);
                      *(uint *)(local_830.ray + 0x41c) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x41c);
                      *(uint *)(local_830.ray + 0x420) =
                           (uint)(bVar102 & 1) * iVar88 |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x420);
                      *(uint *)(local_830.ray + 0x424) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_830.ray + 0x424);
                      *(uint *)(local_830.ray + 0x428) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_830.ray + 0x428);
                      *(uint *)(local_830.ray + 0x42c) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_830.ray + 0x42c);
                      *(uint *)(local_830.ray + 0x430) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_830.ray + 0x430);
                      *(uint *)(local_830.ray + 0x434) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_830.ray + 0x434);
                      *(uint *)(local_830.ray + 0x438) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_830.ray + 0x438);
                      *(uint *)(local_830.ray + 0x43c) =
                           (uint)bVar32 * iVar95 | (uint)!bVar32 * *(int *)(local_830.ray + 0x43c);
                      auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                      auVar222 = vmovdqu32_avx512f(auVar222);
                      *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar222;
                      auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                      auVar222 = vmovdqu32_avx512f(auVar222);
                      *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar222;
                      auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                      auVar222 = vmovdqa32_avx512f(auVar222);
                      *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar222;
                      auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                      auVar222 = vmovdqa32_avx512f(auVar222);
                      *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar222;
                      local_740 = *(float *)(ray + k * 4 + 0x200);
                      fStack_73c = 0.0;
                      fStack_738 = 0.0;
                      fStack_734 = 0.0;
                    }
                    auVar126 = auVar185._0_32_;
                    bVar111 = ~(byte)(1 << ((uint)uVar103 & 0x1f)) & (byte)uVar109;
                    auVar183._4_4_ = local_740;
                    auVar183._0_4_ = local_740;
                    auVar183._8_4_ = local_740;
                    auVar183._12_4_ = local_740;
                    auVar183._16_4_ = local_740;
                    auVar183._20_4_ = local_740;
                    auVar183._24_4_ = local_740;
                    auVar183._28_4_ = local_740;
                    uVar35 = vcmpps_avx512vl(auVar225._0_32_,auVar183,2);
                    if ((bVar111 & (byte)uVar35) == 0) goto LAB_01a900b7;
                    bVar111 = bVar111 & (byte)uVar35;
                    uVar109 = (ulong)bVar111;
                    auVar184._8_4_ = 0x7f800000;
                    auVar184._0_8_ = 0x7f8000007f800000;
                    auVar184._12_4_ = 0x7f800000;
                    auVar184._16_4_ = 0x7f800000;
                    auVar184._20_4_ = 0x7f800000;
                    auVar184._24_4_ = 0x7f800000;
                    auVar184._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar184,auVar225._0_32_);
                    auVar163._0_4_ =
                         (uint)(bVar111 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 1 & 1);
                    auVar163._4_4_ = (uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 2 & 1);
                    auVar163._8_4_ = (uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 3 & 1);
                    auVar163._12_4_ = (uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 4 & 1);
                    auVar163._16_4_ = (uint)bVar19 * auVar126._16_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 5 & 1);
                    auVar163._20_4_ = (uint)bVar19 * auVar126._20_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar111 >> 6 & 1);
                    auVar163._24_4_ = (uint)bVar19 * auVar126._24_4_ | (uint)!bVar19 * 0x7f800000;
                    auVar163._28_4_ =
                         (uint)(bVar111 >> 7) * auVar126._28_4_ |
                         (uint)!(bool)(bVar111 >> 7) * 0x7f800000;
                    auVar126 = vshufps_avx(auVar163,auVar163,0xb1);
                    auVar126 = vminps_avx(auVar163,auVar126);
                    auVar124 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    auVar124 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    uVar35 = vcmpps_avx512vl(auVar163,auVar126,0);
                    bVar102 = (byte)uVar35 & bVar111;
                    if (bVar102 != 0) {
                      bVar111 = bVar102;
                    }
                    uVar110 = 0;
                    for (uVar104 = (uint)bVar111; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x80000000) {
                      uVar110 = uVar110 + 1;
                    }
                    uVar103 = (ulong)uVar110;
                  } while( true );
                }
                fVar189 = local_4e0[uVar103];
                uVar173 = *(undefined4 *)(local_4c0 + uVar103 * 4);
                fVar186 = 1.0 - fVar189;
                fVar172 = fVar186 * fVar186 * -3.0;
                auVar214 = ZEXT464((uint)fVar172);
                auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186)),
                                           ZEXT416((uint)(fVar189 * fVar186)),ZEXT416(0xc0000000));
                auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar186)),
                                           ZEXT416((uint)(fVar189 * fVar189)),ZEXT416(0x40000000));
                fVar186 = auVar118._0_4_ * 3.0;
                fVar187 = auVar119._0_4_ * 3.0;
                fVar198 = fVar189 * fVar189 * 3.0;
                auVar215._0_4_ = fVar198 * local_890;
                auVar215._4_4_ = fVar198 * fStack_88c;
                auVar215._8_4_ = fVar198 * fStack_888;
                auVar215._12_4_ = fVar198 * fStack_884;
                auVar220 = ZEXT1664(auVar215);
                auVar190._4_4_ = fVar187;
                auVar190._0_4_ = fVar187;
                auVar190._8_4_ = fVar187;
                auVar190._12_4_ = fVar187;
                auVar118 = vfmadd132ps_fma(auVar190,auVar215,*pauVar4);
                auVar201._4_4_ = fVar186;
                auVar201._0_4_ = fVar186;
                auVar201._8_4_ = fVar186;
                auVar201._12_4_ = fVar186;
                auVar118 = vfmadd132ps_fma(auVar201,auVar118,*pauVar3);
                auVar191._4_4_ = fVar172;
                auVar191._0_4_ = fVar172;
                auVar191._8_4_ = fVar172;
                auVar191._12_4_ = fVar172;
                auVar118 = vfmadd213ps_fma(auVar191,auVar33,auVar118);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar103 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar118._0_4_;
                uVar17 = vextractps_avx(auVar118,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar17;
                uVar17 = vextractps_avx(auVar118,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar17;
                *(float *)(ray + k * 4 + 0x3c0) = fVar189;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar173;
                *(uint *)(ray + k * 4 + 0x440) = uVar15;
                *(uint *)(ray + k * 4 + 0x480) = uVar14;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01a900b7:
                auVar222 = ZEXT1664(auVar33);
                fVar189 = (float)local_800._0_4_;
              }
            }
          }
        }
      }
    }
    local_800._0_4_ = fVar189;
    if (8 < iVar16) {
      auVar124 = vpbroadcastd_avx512vl();
      auVar185 = ZEXT3264(auVar124);
      local_740 = (float)local_800._0_4_;
      fStack_73c = (float)local_800._0_4_;
      fStack_738 = (float)local_800._0_4_;
      fStack_734 = (float)local_800._0_4_;
      fStack_730 = (float)local_800._0_4_;
      fStack_72c = (float)local_800._0_4_;
      fStack_728 = (float)local_800._0_4_;
      fStack_724 = (float)local_800._0_4_;
      uStack_71c = local_720;
      uStack_718 = local_720;
      uStack_714 = local_720;
      uStack_710 = local_720;
      uStack_70c = local_720;
      uStack_708 = local_720;
      uStack_704 = local_720;
      local_440 = 1.0 / (float)local_7a0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar105 = 8;
      local_7e0 = auVar126;
LAB_01a90154:
      if (lVar105 < iVar16) {
        auVar126 = vpbroadcastd_avx512vl();
        auVar126 = vpor_avx2(auVar126,_DAT_01fb4ba0);
        uVar36 = vpcmpgtd_avx512vl(auVar185._0_32_,auVar126);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar105 * 4 + lVar107);
        auVar124 = *(undefined1 (*) [32])(lVar107 + 0x21fb768 + lVar105 * 4);
        auVar138 = *(undefined1 (*) [32])(lVar107 + 0x21fbbec + lVar105 * 4);
        auVar137 = *(undefined1 (*) [32])(lVar107 + 0x21fc070 + lVar105 * 4);
        auVar225._0_4_ = auVar137._0_4_ * (float)local_680._0_4_;
        auVar225._4_4_ = auVar137._4_4_ * (float)local_680._4_4_;
        auVar225._8_4_ = auVar137._8_4_ * fStack_678;
        auVar225._12_4_ = auVar137._12_4_ * fStack_674;
        auVar225._16_4_ = auVar137._16_4_ * fStack_670;
        auVar225._20_4_ = auVar137._20_4_ * fStack_66c;
        auVar225._28_36_ = auVar220._28_36_;
        auVar225._24_4_ = auVar137._24_4_ * fStack_668;
        auVar220._0_4_ = auVar137._0_4_ * (float)local_6a0._0_4_;
        auVar220._4_4_ = auVar137._4_4_ * (float)local_6a0._4_4_;
        auVar220._8_4_ = auVar137._8_4_ * fStack_698;
        auVar220._12_4_ = auVar137._12_4_ * fStack_694;
        auVar220._16_4_ = auVar137._16_4_ * fStack_690;
        auVar220._20_4_ = auVar137._20_4_ * fStack_68c;
        auVar220._28_36_ = auVar214._28_36_;
        auVar220._24_4_ = auVar137._24_4_ * fStack_688;
        auVar136 = vmulps_avx512vl(local_420,auVar137);
        local_760 = auVar237._0_32_;
        auVar125 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar138,local_640);
        auVar127 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar138,local_660);
        auVar136 = vfmadd231ps_avx512vl(auVar136,auVar138,local_400);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,local_600);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar124,local_620);
        auVar135 = vfmadd231ps_avx512vl(auVar136,auVar124,local_3e0);
        auVar118 = vfmadd231ps_fma(auVar125,auVar126,local_5c0);
        auVar220 = ZEXT1664(auVar118);
        auVar119 = vfmadd231ps_fma(auVar127,auVar126,local_5e0);
        auVar214 = ZEXT1664(auVar119);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar105 * 4 + lVar107);
        auVar125 = *(undefined1 (*) [32])(lVar107 + 0x21fdb88 + lVar105 * 4);
        auVar130 = vfmadd231ps_avx512vl(auVar135,auVar126,local_3c0);
        auVar127 = *(undefined1 (*) [32])(lVar107 + 0x21fe00c + lVar105 * 4);
        auVar135 = *(undefined1 (*) [32])(lVar107 + 0x21fe490 + lVar105 * 4);
        auVar237._0_4_ = auVar135._0_4_ * (float)local_680._0_4_;
        auVar237._4_4_ = auVar135._4_4_ * (float)local_680._4_4_;
        auVar237._8_4_ = auVar135._8_4_ * fStack_678;
        auVar237._12_4_ = auVar135._12_4_ * fStack_674;
        auVar237._16_4_ = auVar135._16_4_ * fStack_670;
        auVar237._20_4_ = auVar135._20_4_ * fStack_66c;
        auVar237._28_36_ = auVar222._28_36_;
        auVar237._24_4_ = auVar135._24_4_ * fStack_668;
        auVar66._4_4_ = auVar135._4_4_ * (float)local_6a0._4_4_;
        auVar66._0_4_ = auVar135._0_4_ * (float)local_6a0._0_4_;
        auVar66._8_4_ = auVar135._8_4_ * fStack_698;
        auVar66._12_4_ = auVar135._12_4_ * fStack_694;
        auVar66._16_4_ = auVar135._16_4_ * fStack_690;
        auVar66._20_4_ = auVar135._20_4_ * fStack_68c;
        auVar66._24_4_ = auVar135._24_4_ * fStack_688;
        auVar66._28_4_ = uStack_684;
        auVar128 = vmulps_avx512vl(local_420,auVar135);
        auVar129 = vfmadd231ps_avx512vl(auVar237._0_32_,auVar127,local_640);
        auVar237 = ZEXT3264(local_760);
        auVar123 = vfmadd231ps_avx512vl(auVar66,auVar127,local_660);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar127,local_400);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar125,local_600);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_620);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,local_3e0);
        auVar8 = vfmadd231ps_fma(auVar129,auVar136,local_5c0);
        auVar222 = ZEXT1664(auVar8);
        auVar9 = vfmadd231ps_fma(auVar123,auVar136,local_5e0);
        auVar123 = vfmadd231ps_avx512vl(auVar128,auVar136,local_3c0);
        auVar121 = vmaxps_avx512vl(auVar130,auVar123);
        auVar128 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar118));
        auVar129 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar119));
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar119),auVar128);
        auVar131 = vmulps_avx512vl(ZEXT1632(auVar118),auVar129);
        auVar122 = vsubps_avx512vl(auVar122,auVar131);
        auVar131 = vmulps_avx512vl(auVar129,auVar129);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar128,auVar128);
        auVar121 = vmulps_avx512vl(auVar121,auVar121);
        auVar121 = vmulps_avx512vl(auVar121,auVar131);
        auVar122 = vmulps_avx512vl(auVar122,auVar122);
        uVar35 = vcmpps_avx512vl(auVar122,auVar121,2);
        bVar111 = (byte)uVar36 & (byte)uVar35;
        if (bVar111 != 0) {
          auVar135 = vmulps_avx512vl(local_480,auVar135);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_7e0,auVar135);
          local_780 = auVar238._0_32_;
          auVar125 = vfmadd213ps_avx512vl(auVar125,local_780,auVar127);
          auVar136 = vfmadd213ps_avx512vl(auVar136,local_760,auVar125);
          auVar137 = vmulps_avx512vl(local_480,auVar137);
          auVar138 = vfmadd213ps_avx512vl(auVar138,local_7e0,auVar137);
          auVar124 = vfmadd213ps_avx512vl(auVar124,local_780,auVar138);
          auVar125 = vfmadd213ps_avx512vl(auVar126,local_760,auVar124);
          auVar126 = *(undefined1 (*) [32])(lVar107 + 0x21fc4f4 + lVar105 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar107 + 0x21fc978 + lVar105 * 4);
          auVar138 = *(undefined1 (*) [32])(lVar107 + 0x21fcdfc + lVar105 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar107 + 0x21fd280 + lVar105 * 4);
          auVar127 = vmulps_avx512vl(_local_680,auVar137);
          auVar135 = vmulps_avx512vl(_local_6a0,auVar137);
          auVar137 = vmulps_avx512vl(local_480,auVar137);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar138,local_640);
          auVar135 = vfmadd231ps_avx512vl(auVar135,auVar138,local_660);
          auVar117 = vfmadd231ps_fma(auVar137,auVar138,local_7e0);
          auVar138 = vfmadd231ps_avx512vl(auVar127,auVar124,local_600);
          auVar137 = vfmadd231ps_avx512vl(auVar135,auVar124,local_620);
          auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),local_780,auVar124);
          auVar127 = vfmadd231ps_avx512vl(auVar138,auVar126,local_5c0);
          auVar137 = vfmadd231ps_avx512vl(auVar137,auVar126,local_5e0);
          auVar135 = vfmadd231ps_avx512vl(auVar124,local_760,auVar126);
          auVar126 = *(undefined1 (*) [32])(lVar107 + 0x21fe914 + lVar105 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar107 + 0x21ff21c + lVar105 * 4);
          auVar138 = *(undefined1 (*) [32])(lVar107 + 0x21ff6a0 + lVar105 * 4);
          auVar121 = vmulps_avx512vl(_local_680,auVar138);
          auVar122 = vmulps_avx512vl(_local_6a0,auVar138);
          auVar138 = vmulps_avx512vl(local_480,auVar138);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_640);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar124,local_660);
          auVar138 = vfmadd231ps_avx512vl(auVar138,local_7e0,auVar124);
          auVar124 = *(undefined1 (*) [32])(lVar107 + 0x21fed98 + lVar105 * 4);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_600);
          auVar237 = ZEXT3264(local_760);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar124,local_620);
          auVar124 = vfmadd231ps_avx512vl(auVar138,local_780,auVar124);
          auVar138 = vfmadd231ps_avx512vl(auVar121,auVar126,local_5c0);
          auVar121 = vfmadd231ps_avx512vl(auVar122,auVar126,local_5e0);
          auVar124 = vfmadd231ps_avx512vl(auVar124,local_760,auVar126);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar127,auVar122);
          vandps_avx512vl(auVar137,auVar122);
          auVar126 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar135,auVar122);
          auVar126 = vmaxps_avx(auVar126,auVar122);
          auVar100._4_4_ = fStack_73c;
          auVar100._0_4_ = local_740;
          auVar100._8_4_ = fStack_738;
          auVar100._12_4_ = fStack_734;
          auVar100._16_4_ = fStack_730;
          auVar100._20_4_ = fStack_72c;
          auVar100._24_4_ = fStack_728;
          auVar100._28_4_ = fStack_724;
          uVar103 = vcmpps_avx512vl(auVar126,auVar100,1);
          bVar19 = (bool)((byte)uVar103 & 1);
          auVar151._0_4_ = (float)((uint)bVar19 * auVar128._0_4_ | (uint)!bVar19 * auVar127._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar151._4_4_ = (float)((uint)bVar19 * auVar128._4_4_ | (uint)!bVar19 * auVar127._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar151._8_4_ = (float)((uint)bVar19 * auVar128._8_4_ | (uint)!bVar19 * auVar127._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar151._12_4_ =
               (float)((uint)bVar19 * auVar128._12_4_ | (uint)!bVar19 * auVar127._12_4_);
          bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar151._16_4_ =
               (float)((uint)bVar19 * auVar128._16_4_ | (uint)!bVar19 * auVar127._16_4_);
          bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar151._20_4_ =
               (float)((uint)bVar19 * auVar128._20_4_ | (uint)!bVar19 * auVar127._20_4_);
          bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar151._24_4_ =
               (float)((uint)bVar19 * auVar128._24_4_ | (uint)!bVar19 * auVar127._24_4_);
          bVar19 = SUB81(uVar103 >> 7,0);
          auVar151._28_4_ = (uint)bVar19 * auVar128._28_4_ | (uint)!bVar19 * auVar127._28_4_;
          bVar19 = (bool)((byte)uVar103 & 1);
          auVar152._0_4_ = (float)((uint)bVar19 * auVar129._0_4_ | (uint)!bVar19 * auVar137._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar19 * auVar129._4_4_ | (uint)!bVar19 * auVar137._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar19 * auVar129._8_4_ | (uint)!bVar19 * auVar137._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar19 * auVar129._12_4_ | (uint)!bVar19 * auVar137._12_4_);
          bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar152._16_4_ =
               (float)((uint)bVar19 * auVar129._16_4_ | (uint)!bVar19 * auVar137._16_4_);
          bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar152._20_4_ =
               (float)((uint)bVar19 * auVar129._20_4_ | (uint)!bVar19 * auVar137._20_4_);
          bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar152._24_4_ =
               (float)((uint)bVar19 * auVar129._24_4_ | (uint)!bVar19 * auVar137._24_4_);
          bVar19 = SUB81(uVar103 >> 7,0);
          auVar152._28_4_ = (uint)bVar19 * auVar129._28_4_ | (uint)!bVar19 * auVar137._28_4_;
          vandps_avx512vl(auVar138,auVar122);
          vandps_avx512vl(auVar121,auVar122);
          auVar126 = vmaxps_avx(auVar152,auVar152);
          vandps_avx512vl(auVar124,auVar122);
          auVar126 = vmaxps_avx(auVar126,auVar152);
          uVar103 = vcmpps_avx512vl(auVar126,auVar100,1);
          bVar19 = (bool)((byte)uVar103 & 1);
          auVar153._0_4_ = (uint)bVar19 * auVar128._0_4_ | (uint)!bVar19 * auVar138._0_4_;
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar153._4_4_ = (uint)bVar19 * auVar128._4_4_ | (uint)!bVar19 * auVar138._4_4_;
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar153._8_4_ = (uint)bVar19 * auVar128._8_4_ | (uint)!bVar19 * auVar138._8_4_;
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar153._12_4_ = (uint)bVar19 * auVar128._12_4_ | (uint)!bVar19 * auVar138._12_4_;
          bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar153._16_4_ = (uint)bVar19 * auVar128._16_4_ | (uint)!bVar19 * auVar138._16_4_;
          bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar153._20_4_ = (uint)bVar19 * auVar128._20_4_ | (uint)!bVar19 * auVar138._20_4_;
          bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar153._24_4_ = (uint)bVar19 * auVar128._24_4_ | (uint)!bVar19 * auVar138._24_4_;
          bVar19 = SUB81(uVar103 >> 7,0);
          auVar153._28_4_ = (uint)bVar19 * auVar128._28_4_ | (uint)!bVar19 * auVar138._28_4_;
          bVar19 = (bool)((byte)uVar103 & 1);
          auVar154._0_4_ = (float)((uint)bVar19 * auVar129._0_4_ | (uint)!bVar19 * auVar121._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar154._4_4_ = (float)((uint)bVar19 * auVar129._4_4_ | (uint)!bVar19 * auVar121._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar154._8_4_ = (float)((uint)bVar19 * auVar129._8_4_ | (uint)!bVar19 * auVar121._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar154._12_4_ =
               (float)((uint)bVar19 * auVar129._12_4_ | (uint)!bVar19 * auVar121._12_4_);
          bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar154._16_4_ =
               (float)((uint)bVar19 * auVar129._16_4_ | (uint)!bVar19 * auVar121._16_4_);
          bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar154._20_4_ =
               (float)((uint)bVar19 * auVar129._20_4_ | (uint)!bVar19 * auVar121._20_4_);
          bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar154._24_4_ =
               (float)((uint)bVar19 * auVar129._24_4_ | (uint)!bVar19 * auVar121._24_4_);
          bVar19 = SUB81(uVar103 >> 7,0);
          auVar154._28_4_ = (uint)bVar19 * auVar129._28_4_ | (uint)!bVar19 * auVar121._28_4_;
          auVar227._8_4_ = 0x80000000;
          auVar227._0_8_ = 0x8000000080000000;
          auVar227._12_4_ = 0x80000000;
          auVar227._16_4_ = 0x80000000;
          auVar227._20_4_ = 0x80000000;
          auVar227._24_4_ = 0x80000000;
          auVar227._28_4_ = 0x80000000;
          auVar126 = vxorps_avx512vl(auVar153,auVar227);
          auVar120 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
          auVar124 = vfmadd213ps_avx512vl(auVar151,auVar151,ZEXT1632(auVar120));
          auVar117 = vfmadd231ps_fma(auVar124,auVar152,auVar152);
          auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar117));
          auVar236._8_4_ = 0xbf000000;
          auVar236._0_8_ = 0xbf000000bf000000;
          auVar236._12_4_ = 0xbf000000;
          auVar236._16_4_ = 0xbf000000;
          auVar236._20_4_ = 0xbf000000;
          auVar236._24_4_ = 0xbf000000;
          auVar236._28_4_ = 0xbf000000;
          fVar189 = auVar124._0_4_;
          fVar172 = auVar124._4_4_;
          fVar186 = auVar124._8_4_;
          fVar187 = auVar124._12_4_;
          fVar198 = auVar124._16_4_;
          fVar197 = auVar124._20_4_;
          fVar208 = auVar124._24_4_;
          auVar67._4_4_ = fVar172 * fVar172 * fVar172 * auVar117._4_4_ * -0.5;
          auVar67._0_4_ = fVar189 * fVar189 * fVar189 * auVar117._0_4_ * -0.5;
          auVar67._8_4_ = fVar186 * fVar186 * fVar186 * auVar117._8_4_ * -0.5;
          auVar67._12_4_ = fVar187 * fVar187 * fVar187 * auVar117._12_4_ * -0.5;
          auVar67._16_4_ = fVar198 * fVar198 * fVar198 * -0.0;
          auVar67._20_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar67._24_4_ = fVar208 * fVar208 * fVar208 * -0.0;
          auVar67._28_4_ = auVar152._28_4_;
          auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar124 = vfmadd231ps_avx512vl(auVar67,auVar138,auVar124);
          auVar68._4_4_ = auVar152._4_4_ * auVar124._4_4_;
          auVar68._0_4_ = auVar152._0_4_ * auVar124._0_4_;
          auVar68._8_4_ = auVar152._8_4_ * auVar124._8_4_;
          auVar68._12_4_ = auVar152._12_4_ * auVar124._12_4_;
          auVar68._16_4_ = auVar152._16_4_ * auVar124._16_4_;
          auVar68._20_4_ = auVar152._20_4_ * auVar124._20_4_;
          auVar68._24_4_ = auVar152._24_4_ * auVar124._24_4_;
          auVar68._28_4_ = 0;
          auVar69._4_4_ = auVar124._4_4_ * -auVar151._4_4_;
          auVar69._0_4_ = auVar124._0_4_ * -auVar151._0_4_;
          auVar69._8_4_ = auVar124._8_4_ * -auVar151._8_4_;
          auVar69._12_4_ = auVar124._12_4_ * -auVar151._12_4_;
          auVar69._16_4_ = auVar124._16_4_ * -auVar151._16_4_;
          auVar69._20_4_ = auVar124._20_4_ * -auVar151._20_4_;
          auVar69._24_4_ = auVar124._24_4_ * -auVar151._24_4_;
          auVar69._28_4_ = auVar152._28_4_;
          auVar137 = vmulps_avx512vl(auVar124,ZEXT1632(auVar120));
          auVar135 = ZEXT1632(auVar120);
          auVar124 = vfmadd213ps_avx512vl(auVar153,auVar153,auVar135);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar154,auVar154);
          auVar127 = vrsqrt14ps_avx512vl(auVar124);
          auVar124 = vmulps_avx512vl(auVar124,auVar236);
          fVar189 = auVar127._0_4_;
          fVar172 = auVar127._4_4_;
          fVar186 = auVar127._8_4_;
          fVar187 = auVar127._12_4_;
          fVar198 = auVar127._16_4_;
          fVar197 = auVar127._20_4_;
          fVar208 = auVar127._24_4_;
          auVar70._4_4_ = fVar172 * fVar172 * fVar172 * auVar124._4_4_;
          auVar70._0_4_ = fVar189 * fVar189 * fVar189 * auVar124._0_4_;
          auVar70._8_4_ = fVar186 * fVar186 * fVar186 * auVar124._8_4_;
          auVar70._12_4_ = fVar187 * fVar187 * fVar187 * auVar124._12_4_;
          auVar70._16_4_ = fVar198 * fVar198 * fVar198 * auVar124._16_4_;
          auVar70._20_4_ = fVar197 * fVar197 * fVar197 * auVar124._20_4_;
          auVar70._24_4_ = fVar208 * fVar208 * fVar208 * auVar124._24_4_;
          auVar70._28_4_ = auVar124._28_4_;
          auVar124 = vfmadd231ps_avx512vl(auVar70,auVar138,auVar127);
          auVar71._4_4_ = auVar154._4_4_ * auVar124._4_4_;
          auVar71._0_4_ = auVar154._0_4_ * auVar124._0_4_;
          auVar71._8_4_ = auVar154._8_4_ * auVar124._8_4_;
          auVar71._12_4_ = auVar154._12_4_ * auVar124._12_4_;
          auVar71._16_4_ = auVar154._16_4_ * auVar124._16_4_;
          auVar71._20_4_ = auVar154._20_4_ * auVar124._20_4_;
          auVar71._24_4_ = auVar154._24_4_ * auVar124._24_4_;
          auVar71._28_4_ = auVar127._28_4_;
          auVar72._4_4_ = auVar124._4_4_ * auVar126._4_4_;
          auVar72._0_4_ = auVar124._0_4_ * auVar126._0_4_;
          auVar72._8_4_ = auVar124._8_4_ * auVar126._8_4_;
          auVar72._12_4_ = auVar124._12_4_ * auVar126._12_4_;
          auVar72._16_4_ = auVar124._16_4_ * auVar126._16_4_;
          auVar72._20_4_ = auVar124._20_4_ * auVar126._20_4_;
          auVar72._24_4_ = auVar124._24_4_ * auVar126._24_4_;
          auVar72._28_4_ = auVar126._28_4_;
          auVar126 = vmulps_avx512vl(auVar124,auVar135);
          auVar117 = vfmadd213ps_fma(auVar68,auVar130,ZEXT1632(auVar118));
          auVar176 = vfmadd213ps_fma(auVar69,auVar130,ZEXT1632(auVar119));
          auVar138 = vfmadd213ps_avx512vl(auVar137,auVar130,auVar125);
          auVar127 = vfmadd213ps_avx512vl(auVar71,auVar123,ZEXT1632(auVar8));
          auVar113 = vfnmadd213ps_fma(auVar68,auVar130,ZEXT1632(auVar118));
          auVar118 = vfmadd213ps_fma(auVar72,auVar123,ZEXT1632(auVar9));
          auVar223 = vfnmadd213ps_fma(auVar69,auVar130,ZEXT1632(auVar119));
          auVar119 = vfmadd213ps_fma(auVar126,auVar123,auVar136);
          auVar39 = vfnmadd231ps_fma(auVar125,auVar130,auVar137);
          auVar199 = vfnmadd213ps_fma(auVar71,auVar123,ZEXT1632(auVar8));
          auVar114 = vfnmadd213ps_fma(auVar72,auVar123,ZEXT1632(auVar9));
          auVar115 = vfnmadd231ps_fma(auVar136,auVar123,auVar126);
          auVar136 = vsubps_avx512vl(auVar127,ZEXT1632(auVar113));
          auVar126 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar223));
          auVar124 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar39));
          auVar73._4_4_ = auVar126._4_4_ * auVar39._4_4_;
          auVar73._0_4_ = auVar126._0_4_ * auVar39._0_4_;
          auVar73._8_4_ = auVar126._8_4_ * auVar39._8_4_;
          auVar73._12_4_ = auVar126._12_4_ * auVar39._12_4_;
          auVar73._16_4_ = auVar126._16_4_ * 0.0;
          auVar73._20_4_ = auVar126._20_4_ * 0.0;
          auVar73._24_4_ = auVar126._24_4_ * 0.0;
          auVar73._28_4_ = auVar137._28_4_;
          auVar8 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar223),auVar124);
          auVar74._4_4_ = auVar124._4_4_ * auVar113._4_4_;
          auVar74._0_4_ = auVar124._0_4_ * auVar113._0_4_;
          auVar74._8_4_ = auVar124._8_4_ * auVar113._8_4_;
          auVar74._12_4_ = auVar124._12_4_ * auVar113._12_4_;
          auVar74._16_4_ = auVar124._16_4_ * 0.0;
          auVar74._20_4_ = auVar124._20_4_ * 0.0;
          auVar74._24_4_ = auVar124._24_4_ * 0.0;
          auVar74._28_4_ = auVar124._28_4_;
          auVar9 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar39),auVar136);
          auVar75._4_4_ = auVar223._4_4_ * auVar136._4_4_;
          auVar75._0_4_ = auVar223._0_4_ * auVar136._0_4_;
          auVar75._8_4_ = auVar223._8_4_ * auVar136._8_4_;
          auVar75._12_4_ = auVar223._12_4_ * auVar136._12_4_;
          auVar75._16_4_ = auVar136._16_4_ * 0.0;
          auVar75._20_4_ = auVar136._20_4_ * 0.0;
          auVar75._24_4_ = auVar136._24_4_ * 0.0;
          auVar75._28_4_ = auVar136._28_4_;
          auVar116 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar113),auVar126);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),auVar135,ZEXT1632(auVar9));
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar135,ZEXT1632(auVar8));
          auVar122 = ZEXT1632(auVar120);
          uVar103 = vcmpps_avx512vl(auVar126,auVar122,2);
          bVar102 = (byte)uVar103;
          fVar164 = (float)((uint)(bVar102 & 1) * auVar117._0_4_ |
                           (uint)!(bool)(bVar102 & 1) * auVar199._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          fVar166 = (float)((uint)bVar19 * auVar117._4_4_ | (uint)!bVar19 * auVar199._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          fVar168 = (float)((uint)bVar19 * auVar117._8_4_ | (uint)!bVar19 * auVar199._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          fVar170 = (float)((uint)bVar19 * auVar117._12_4_ | (uint)!bVar19 * auVar199._12_4_);
          auVar135 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar168,CONCAT44(fVar166,fVar164))));
          fVar165 = (float)((uint)(bVar102 & 1) * auVar176._0_4_ |
                           (uint)!(bool)(bVar102 & 1) * auVar114._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          fVar167 = (float)((uint)bVar19 * auVar176._4_4_ | (uint)!bVar19 * auVar114._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          fVar169 = (float)((uint)bVar19 * auVar176._8_4_ | (uint)!bVar19 * auVar114._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          fVar171 = (float)((uint)bVar19 * auVar176._12_4_ | (uint)!bVar19 * auVar114._12_4_);
          auVar128 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar169,CONCAT44(fVar167,fVar165))));
          auVar155._0_4_ =
               (float)((uint)(bVar102 & 1) * auVar138._0_4_ |
                      (uint)!(bool)(bVar102 & 1) * auVar115._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar155._4_4_ = (float)((uint)bVar19 * auVar138._4_4_ | (uint)!bVar19 * auVar115._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar155._8_4_ = (float)((uint)bVar19 * auVar138._8_4_ | (uint)!bVar19 * auVar115._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar155._12_4_ =
               (float)((uint)bVar19 * auVar138._12_4_ | (uint)!bVar19 * auVar115._12_4_);
          fVar186 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_);
          auVar155._16_4_ = fVar186;
          fVar172 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_);
          auVar155._20_4_ = fVar172;
          fVar189 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_);
          auVar155._24_4_ = fVar189;
          iVar1 = (uint)(byte)(uVar103 >> 7) * auVar138._28_4_;
          auVar155._28_4_ = iVar1;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar113),auVar127);
          auVar156._0_4_ =
               (uint)(bVar102 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar8._0_4_;
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar156._4_4_ = (uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * auVar8._4_4_;
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar156._8_4_ = (uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * auVar8._8_4_;
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar156._12_4_ = (uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * auVar8._12_4_;
          auVar156._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar126._16_4_;
          auVar156._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar126._20_4_;
          auVar156._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar126._24_4_;
          auVar156._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar126._28_4_;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar223),ZEXT1632(auVar118));
          auVar157._0_4_ =
               (float)((uint)(bVar102 & 1) * auVar126._0_4_ |
                      (uint)!(bool)(bVar102 & 1) * auVar117._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar157._4_4_ = (float)((uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * auVar117._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar157._8_4_ = (float)((uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * auVar117._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar157._12_4_ =
               (float)((uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * auVar117._12_4_);
          fVar187 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar126._16_4_);
          auVar157._16_4_ = fVar187;
          fVar198 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar126._20_4_);
          auVar157._20_4_ = fVar198;
          fVar197 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar126._24_4_);
          auVar157._24_4_ = fVar197;
          auVar157._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar126._28_4_;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar39),ZEXT1632(auVar119));
          auVar158._0_4_ =
               (float)((uint)(bVar102 & 1) * auVar126._0_4_ |
                      (uint)!(bool)(bVar102 & 1) * auVar176._0_4_);
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar158._4_4_ = (float)((uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * auVar176._4_4_);
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar158._8_4_ = (float)((uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * auVar176._8_4_);
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar158._12_4_ =
               (float)((uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * auVar176._12_4_);
          fVar196 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar126._16_4_);
          auVar158._16_4_ = fVar196;
          fVar112 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar126._20_4_);
          auVar158._20_4_ = fVar112;
          fVar208 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar126._24_4_);
          auVar158._24_4_ = fVar208;
          iVar2 = (uint)(byte)(uVar103 >> 7) * auVar126._28_4_;
          auVar158._28_4_ = iVar2;
          auVar159._0_4_ =
               (uint)(bVar102 & 1) * (int)auVar113._0_4_ |
               (uint)!(bool)(bVar102 & 1) * auVar127._0_4_;
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar159._4_4_ = (uint)bVar19 * (int)auVar113._4_4_ | (uint)!bVar19 * auVar127._4_4_;
          bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar159._8_4_ = (uint)bVar19 * (int)auVar113._8_4_ | (uint)!bVar19 * auVar127._8_4_;
          bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar159._12_4_ = (uint)bVar19 * (int)auVar113._12_4_ | (uint)!bVar19 * auVar127._12_4_;
          auVar159._16_4_ = (uint)!(bool)((byte)(uVar103 >> 4) & 1) * auVar127._16_4_;
          auVar159._20_4_ = (uint)!(bool)((byte)(uVar103 >> 5) & 1) * auVar127._20_4_;
          auVar159._24_4_ = (uint)!(bool)((byte)(uVar103 >> 6) & 1) * auVar127._24_4_;
          auVar159._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar127._28_4_;
          bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar103 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar103 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar103 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar103 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar127 = vsubps_avx512vl(auVar159,auVar135);
          auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar223._12_4_ |
                                                   (uint)!bVar23 * auVar118._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar223._8_4_ |
                                                            (uint)!bVar21 * auVar118._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar223._4_4_ |
                                                                     (uint)!bVar19 * auVar118._4_4_,
                                                                     (uint)(bVar102 & 1) *
                                                                     (int)auVar223._0_4_ |
                                                                     (uint)!(bool)(bVar102 & 1) *
                                                                     auVar118._0_4_)))),auVar128);
          auVar220 = ZEXT3264(auVar124);
          auVar138 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar39._12_4_ |
                                                   (uint)!bVar24 * auVar119._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar39._8_4_ |
                                                            (uint)!bVar22 * auVar119._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar39._4_4_ |
                                                                     (uint)!bVar20 * auVar119._4_4_,
                                                                     (uint)(bVar102 & 1) *
                                                                     (int)auVar39._0_4_ |
                                                                     (uint)!(bool)(bVar102 & 1) *
                                                                     auVar119._0_4_)))),auVar155);
          auVar137 = vsubps_avx(auVar135,auVar156);
          auVar222 = ZEXT3264(auVar137);
          auVar136 = vsubps_avx(auVar128,auVar157);
          auVar125 = vsubps_avx(auVar155,auVar158);
          auVar76._4_4_ = auVar138._4_4_ * fVar166;
          auVar76._0_4_ = auVar138._0_4_ * fVar164;
          auVar76._8_4_ = auVar138._8_4_ * fVar168;
          auVar76._12_4_ = auVar138._12_4_ * fVar170;
          auVar76._16_4_ = auVar138._16_4_ * 0.0;
          auVar76._20_4_ = auVar138._20_4_ * 0.0;
          auVar76._24_4_ = auVar138._24_4_ * 0.0;
          auVar76._28_4_ = 0;
          auVar118 = vfmsub231ps_fma(auVar76,auVar155,auVar127);
          auVar206._0_4_ = fVar165 * auVar127._0_4_;
          auVar206._4_4_ = fVar167 * auVar127._4_4_;
          auVar206._8_4_ = fVar169 * auVar127._8_4_;
          auVar206._12_4_ = fVar171 * auVar127._12_4_;
          auVar206._16_4_ = auVar127._16_4_ * 0.0;
          auVar206._20_4_ = auVar127._20_4_ * 0.0;
          auVar206._24_4_ = auVar127._24_4_ * 0.0;
          auVar206._28_4_ = 0;
          auVar119 = vfmsub231ps_fma(auVar206,auVar135,auVar124);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar122,ZEXT1632(auVar118));
          auVar212._0_4_ = auVar124._0_4_ * auVar155._0_4_;
          auVar212._4_4_ = auVar124._4_4_ * auVar155._4_4_;
          auVar212._8_4_ = auVar124._8_4_ * auVar155._8_4_;
          auVar212._12_4_ = auVar124._12_4_ * auVar155._12_4_;
          auVar212._16_4_ = auVar124._16_4_ * fVar186;
          auVar212._20_4_ = auVar124._20_4_ * fVar172;
          auVar212._24_4_ = auVar124._24_4_ * fVar189;
          auVar212._28_4_ = 0;
          auVar118 = vfmsub231ps_fma(auVar212,auVar128,auVar138);
          auVar129 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar118));
          auVar126 = vmulps_avx512vl(auVar125,auVar156);
          auVar126 = vfmsub231ps_avx512vl(auVar126,auVar137,auVar158);
          auVar77._4_4_ = auVar136._4_4_ * auVar158._4_4_;
          auVar77._0_4_ = auVar136._0_4_ * auVar158._0_4_;
          auVar77._8_4_ = auVar136._8_4_ * auVar158._8_4_;
          auVar77._12_4_ = auVar136._12_4_ * auVar158._12_4_;
          auVar77._16_4_ = auVar136._16_4_ * fVar196;
          auVar77._20_4_ = auVar136._20_4_ * fVar112;
          auVar77._24_4_ = auVar136._24_4_ * fVar208;
          auVar77._28_4_ = iVar2;
          auVar118 = vfmsub231ps_fma(auVar77,auVar157,auVar125);
          auVar213._0_4_ = auVar157._0_4_ * auVar137._0_4_;
          auVar213._4_4_ = auVar157._4_4_ * auVar137._4_4_;
          auVar213._8_4_ = auVar157._8_4_ * auVar137._8_4_;
          auVar213._12_4_ = auVar157._12_4_ * auVar137._12_4_;
          auVar213._16_4_ = fVar187 * auVar137._16_4_;
          auVar213._20_4_ = fVar198 * auVar137._20_4_;
          auVar213._24_4_ = fVar197 * auVar137._24_4_;
          auVar213._28_4_ = 0;
          auVar119 = vfmsub231ps_fma(auVar213,auVar136,auVar156);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar122,auVar126);
          auVar121 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar118));
          auVar214 = ZEXT3264(auVar121);
          auVar126 = vmaxps_avx(auVar129,auVar121);
          uVar35 = vcmpps_avx512vl(auVar126,auVar122,2);
          bVar111 = bVar111 & (byte)uVar35;
          if (bVar111 != 0) {
            auVar78._4_4_ = auVar125._4_4_ * auVar124._4_4_;
            auVar78._0_4_ = auVar125._0_4_ * auVar124._0_4_;
            auVar78._8_4_ = auVar125._8_4_ * auVar124._8_4_;
            auVar78._12_4_ = auVar125._12_4_ * auVar124._12_4_;
            auVar78._16_4_ = auVar125._16_4_ * auVar124._16_4_;
            auVar78._20_4_ = auVar125._20_4_ * auVar124._20_4_;
            auVar78._24_4_ = auVar125._24_4_ * auVar124._24_4_;
            auVar78._28_4_ = auVar126._28_4_;
            auVar9 = vfmsub231ps_fma(auVar78,auVar136,auVar138);
            auVar79._4_4_ = auVar138._4_4_ * auVar137._4_4_;
            auVar79._0_4_ = auVar138._0_4_ * auVar137._0_4_;
            auVar79._8_4_ = auVar138._8_4_ * auVar137._8_4_;
            auVar79._12_4_ = auVar138._12_4_ * auVar137._12_4_;
            auVar79._16_4_ = auVar138._16_4_ * auVar137._16_4_;
            auVar79._20_4_ = auVar138._20_4_ * auVar137._20_4_;
            auVar79._24_4_ = auVar138._24_4_ * auVar137._24_4_;
            auVar79._28_4_ = auVar138._28_4_;
            auVar8 = vfmsub231ps_fma(auVar79,auVar127,auVar125);
            auVar80._4_4_ = auVar136._4_4_ * auVar127._4_4_;
            auVar80._0_4_ = auVar136._0_4_ * auVar127._0_4_;
            auVar80._8_4_ = auVar136._8_4_ * auVar127._8_4_;
            auVar80._12_4_ = auVar136._12_4_ * auVar127._12_4_;
            auVar80._16_4_ = auVar136._16_4_ * auVar127._16_4_;
            auVar80._20_4_ = auVar136._20_4_ * auVar127._20_4_;
            auVar80._24_4_ = auVar136._24_4_ * auVar127._24_4_;
            auVar80._28_4_ = auVar136._28_4_;
            auVar117 = vfmsub231ps_fma(auVar80,auVar137,auVar124);
            auVar118 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar117));
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar9),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar119));
            auVar222 = ZEXT3264(auVar126);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = 0x3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar45._16_4_ = 0x3f800000;
            auVar45._20_4_ = 0x3f800000;
            auVar45._24_4_ = 0x3f800000;
            auVar45._28_4_ = 0x3f800000;
            auVar124 = vfnmadd213ps_avx512vl(auVar126,ZEXT1632(auVar119),auVar45);
            auVar118 = vfmadd132ps_fma(auVar124,auVar126,auVar126);
            auVar220 = ZEXT1664(auVar118);
            auVar81._4_4_ = auVar117._4_4_ * auVar155._4_4_;
            auVar81._0_4_ = auVar117._0_4_ * auVar155._0_4_;
            auVar81._8_4_ = auVar117._8_4_ * auVar155._8_4_;
            auVar81._12_4_ = auVar117._12_4_ * auVar155._12_4_;
            auVar81._16_4_ = fVar186 * 0.0;
            auVar81._20_4_ = fVar172 * 0.0;
            auVar81._24_4_ = fVar189 * 0.0;
            auVar81._28_4_ = iVar1;
            auVar8 = vfmadd231ps_fma(auVar81,auVar128,ZEXT1632(auVar8));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar135,ZEXT1632(auVar9));
            fVar189 = auVar118._0_4_;
            fVar172 = auVar118._4_4_;
            fVar186 = auVar118._8_4_;
            fVar187 = auVar118._12_4_;
            local_560 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar187,
                                           CONCAT48(auVar8._8_4_ * fVar186,
                                                    CONCAT44(auVar8._4_4_ * fVar172,
                                                             auVar8._0_4_ * fVar189))));
            auVar225 = ZEXT3264(local_560);
            auVar101._4_4_ = uStack_71c;
            auVar101._0_4_ = local_720;
            auVar101._8_4_ = uStack_718;
            auVar101._12_4_ = uStack_714;
            auVar101._16_4_ = uStack_710;
            auVar101._20_4_ = uStack_70c;
            auVar101._24_4_ = uStack_708;
            auVar101._28_4_ = uStack_704;
            uVar35 = vcmpps_avx512vl(local_560,auVar101,0xd);
            uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar46._4_4_ = uVar173;
            auVar46._0_4_ = uVar173;
            auVar46._8_4_ = uVar173;
            auVar46._12_4_ = uVar173;
            auVar46._16_4_ = uVar173;
            auVar46._20_4_ = uVar173;
            auVar46._24_4_ = uVar173;
            auVar46._28_4_ = uVar173;
            uVar36 = vcmpps_avx512vl(local_560,auVar46,2);
            bVar111 = (byte)uVar35 & (byte)uVar36 & bVar111;
            if (bVar111 != 0) {
              uVar109 = vcmpps_avx512vl(ZEXT1632(auVar119),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar109 = bVar111 & uVar109;
              if ((char)uVar109 != '\0') {
                fVar198 = auVar129._0_4_ * fVar189;
                fVar197 = auVar129._4_4_ * fVar172;
                auVar82._4_4_ = fVar197;
                auVar82._0_4_ = fVar198;
                fVar208 = auVar129._8_4_ * fVar186;
                auVar82._8_4_ = fVar208;
                fVar112 = auVar129._12_4_ * fVar187;
                auVar82._12_4_ = fVar112;
                fVar196 = auVar129._16_4_ * 0.0;
                auVar82._16_4_ = fVar196;
                fVar164 = auVar129._20_4_ * 0.0;
                auVar82._20_4_ = fVar164;
                fVar165 = auVar129._24_4_ * 0.0;
                auVar82._24_4_ = fVar165;
                auVar82._28_4_ = auVar129._28_4_;
                auVar195._8_4_ = 0x3f800000;
                auVar195._0_8_ = 0x3f8000003f800000;
                auVar195._12_4_ = 0x3f800000;
                auVar195._16_4_ = 0x3f800000;
                auVar195._20_4_ = 0x3f800000;
                auVar195._24_4_ = 0x3f800000;
                auVar195._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar195,auVar82);
                local_5a0._0_4_ =
                     (float)((uint)(bVar102 & 1) * (int)fVar198 |
                            (uint)!(bool)(bVar102 & 1) * auVar126._0_4_);
                bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
                local_5a0._4_4_ =
                     (float)((uint)bVar19 * (int)fVar197 | (uint)!bVar19 * auVar126._4_4_);
                bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
                local_5a0._8_4_ =
                     (float)((uint)bVar19 * (int)fVar208 | (uint)!bVar19 * auVar126._8_4_);
                bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
                local_5a0._12_4_ =
                     (float)((uint)bVar19 * (int)fVar112 | (uint)!bVar19 * auVar126._12_4_);
                bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
                local_5a0._16_4_ =
                     (float)((uint)bVar19 * (int)fVar196 | (uint)!bVar19 * auVar126._16_4_);
                bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
                local_5a0._20_4_ =
                     (float)((uint)bVar19 * (int)fVar164 | (uint)!bVar19 * auVar126._20_4_);
                bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
                local_5a0._24_4_ =
                     (float)((uint)bVar19 * (int)fVar165 | (uint)!bVar19 * auVar126._24_4_);
                bVar19 = SUB81(uVar103 >> 7,0);
                local_5a0._28_4_ =
                     (float)((uint)bVar19 * auVar129._28_4_ | (uint)!bVar19 * auVar126._28_4_);
                auVar126 = vsubps_avx(auVar123,auVar130);
                auVar118 = vfmadd213ps_fma(auVar126,local_5a0,auVar130);
                uVar173 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar47._4_4_ = uVar173;
                auVar47._0_4_ = uVar173;
                auVar47._8_4_ = uVar173;
                auVar47._12_4_ = uVar173;
                auVar47._16_4_ = uVar173;
                auVar47._20_4_ = uVar173;
                auVar47._24_4_ = uVar173;
                auVar47._28_4_ = uVar173;
                auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar118._12_4_ + auVar118._12_4_,
                                                              CONCAT48(auVar118._8_4_ +
                                                                       auVar118._8_4_,
                                                                       CONCAT44(auVar118._4_4_ +
                                                                                auVar118._4_4_,
                                                                                auVar118._0_4_ +
                                                                                auVar118._0_4_)))),
                                           auVar47);
                uVar37 = vcmpps_avx512vl(local_560,auVar126,6);
                uVar109 = uVar109 & uVar37;
                bVar111 = (byte)uVar109;
                if (bVar111 != 0) {
                  auVar188._0_4_ = auVar121._0_4_ * fVar189;
                  auVar188._4_4_ = auVar121._4_4_ * fVar172;
                  auVar188._8_4_ = auVar121._8_4_ * fVar186;
                  auVar188._12_4_ = auVar121._12_4_ * fVar187;
                  auVar188._16_4_ = auVar121._16_4_ * 0.0;
                  auVar188._20_4_ = auVar121._20_4_ * 0.0;
                  auVar188._24_4_ = auVar121._24_4_ * 0.0;
                  auVar188._28_4_ = 0;
                  auVar207._8_4_ = 0x3f800000;
                  auVar207._0_8_ = 0x3f8000003f800000;
                  auVar207._12_4_ = 0x3f800000;
                  auVar207._16_4_ = 0x3f800000;
                  auVar207._20_4_ = 0x3f800000;
                  auVar207._24_4_ = 0x3f800000;
                  auVar207._28_4_ = 0x3f800000;
                  auVar126 = vsubps_avx(auVar207,auVar188);
                  auVar160._0_4_ =
                       (uint)(bVar102 & 1) * (int)auVar188._0_4_ |
                       (uint)!(bool)(bVar102 & 1) * auVar126._0_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar160._4_4_ =
                       (uint)bVar19 * (int)auVar188._4_4_ | (uint)!bVar19 * auVar126._4_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar160._8_4_ =
                       (uint)bVar19 * (int)auVar188._8_4_ | (uint)!bVar19 * auVar126._8_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar160._12_4_ =
                       (uint)bVar19 * (int)auVar188._12_4_ | (uint)!bVar19 * auVar126._12_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar160._16_4_ =
                       (uint)bVar19 * (int)auVar188._16_4_ | (uint)!bVar19 * auVar126._16_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar160._20_4_ =
                       (uint)bVar19 * (int)auVar188._20_4_ | (uint)!bVar19 * auVar126._20_4_;
                  bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar160._24_4_ =
                       (uint)bVar19 * (int)auVar188._24_4_ | (uint)!bVar19 * auVar126._24_4_;
                  auVar160._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar126._28_4_;
                  auVar48._8_4_ = 0x40000000;
                  auVar48._0_8_ = 0x4000000040000000;
                  auVar48._12_4_ = 0x40000000;
                  auVar48._16_4_ = 0x40000000;
                  auVar48._20_4_ = 0x40000000;
                  auVar48._24_4_ = 0x40000000;
                  auVar48._28_4_ = 0x40000000;
                  local_580 = vfmsub132ps_avx512vl(auVar160,auVar207,auVar48);
                  local_540 = (undefined4)lVar105;
                  auVar222 = ZEXT1664(auVar33);
                  pGVar106 = (context->scene->geometries).items[uVar14].ptr;
                  if ((pGVar106->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    uVar110 = (uint)uVar109;
                    auVar118 = vcvtsi2ss_avx512f(auVar120,local_540);
                    fVar189 = auVar118._0_4_;
                    local_4e0[0] = (fVar189 + local_5a0._0_4_ + 0.0) * local_440;
                    local_4e0[1] = (fVar189 + local_5a0._4_4_ + 1.0) * fStack_43c;
                    local_4e0[2] = (fVar189 + local_5a0._8_4_ + 2.0) * fStack_438;
                    local_4e0[3] = (fVar189 + local_5a0._12_4_ + 3.0) * fStack_434;
                    fStack_4d0 = (fVar189 + local_5a0._16_4_ + 4.0) * fStack_430;
                    fStack_4cc = (fVar189 + local_5a0._20_4_ + 5.0) * fStack_42c;
                    fStack_4c8 = (fVar189 + local_5a0._24_4_ + 6.0) * fStack_428;
                    fStack_4c4 = fVar189 + local_5a0._28_4_ + 7.0;
                    local_4c0 = local_580;
                    local_4a0 = local_560;
                    auVar180._8_4_ = 0x7f800000;
                    auVar180._0_8_ = 0x7f8000007f800000;
                    auVar180._12_4_ = 0x7f800000;
                    auVar180._16_4_ = 0x7f800000;
                    auVar180._20_4_ = 0x7f800000;
                    auVar180._24_4_ = 0x7f800000;
                    auVar180._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar180,local_560);
                    auVar161._0_4_ =
                         (uint)(bVar111 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 1) & 1);
                    auVar161._4_4_ = (uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 2) & 1);
                    auVar161._8_4_ = (uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    auVar161._12_4_ = (uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 4) & 1);
                    auVar161._16_4_ = (uint)bVar19 * auVar126._16_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 5) & 1);
                    auVar161._20_4_ = (uint)bVar19 * auVar126._20_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar109 >> 6) & 1);
                    auVar161._24_4_ = (uint)bVar19 * auVar126._24_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = SUB81(uVar109 >> 7,0);
                    auVar161._28_4_ = (uint)bVar19 * auVar126._28_4_ | (uint)!bVar19 * 0x7f800000;
                    auVar126 = vshufps_avx(auVar161,auVar161,0xb1);
                    auVar126 = vminps_avx(auVar161,auVar126);
                    auVar124 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    auVar124 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    uVar35 = vcmpps_avx512vl(auVar161,auVar126,0);
                    if ((bVar111 & (byte)uVar35) != 0) {
                      uVar110 = (uint)(bVar111 & (byte)uVar35);
                    }
                    uVar104 = 0;
                    for (; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x80000000) {
                      uVar104 = uVar104 + 1;
                    }
                    uVar103 = (ulong)uVar104;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar185._0_32_);
                      local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7c0._0_8_ = pGVar106;
                      local_7a0 = local_560;
                      local_53c = iVar16;
                      local_530 = auVar33;
                      local_520 = uVar34;
                      uStack_518 = uVar38;
                      local_510 = uVar96;
                      uStack_508 = uVar97;
                      local_500 = uVar98;
                      uStack_4f8 = uVar99;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar103]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_4c0 + uVar103 * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4a0 + uVar103 * 4);
                        local_830.context = context->user;
                        fVar187 = local_200._0_4_;
                        fVar172 = 1.0 - fVar187;
                        fVar189 = fVar172 * fVar172 * -3.0;
                        auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * fVar172)),
                                                   ZEXT416((uint)(fVar187 * fVar172)),
                                                   ZEXT416(0xc0000000));
                        auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar172)),
                                                   ZEXT416((uint)(fVar187 * fVar187)),
                                                   ZEXT416(0x40000000));
                        fVar172 = auVar118._0_4_ * 3.0;
                        fVar186 = auVar119._0_4_ * 3.0;
                        fVar187 = fVar187 * fVar187 * 3.0;
                        auVar217._0_4_ = fVar187 * local_890;
                        auVar217._4_4_ = fVar187 * fStack_88c;
                        auVar217._8_4_ = fVar187 * fStack_888;
                        auVar217._12_4_ = fVar187 * fStack_884;
                        auVar174._4_4_ = fVar186;
                        auVar174._0_4_ = fVar186;
                        auVar174._8_4_ = fVar186;
                        auVar174._12_4_ = fVar186;
                        auVar118 = vfmadd132ps_fma(auVar174,auVar217,auVar12);
                        auVar203._4_4_ = fVar172;
                        auVar203._0_4_ = fVar172;
                        auVar203._8_4_ = fVar172;
                        auVar203._12_4_ = fVar172;
                        auVar118 = vfmadd132ps_fma(auVar203,auVar118,auVar13);
                        auVar175._4_4_ = fVar189;
                        auVar175._0_4_ = fVar189;
                        auVar175._8_4_ = fVar189;
                        auVar175._12_4_ = fVar189;
                        auVar118 = vfmadd213ps_fma(auVar175,auVar33,auVar118);
                        auVar185 = vbroadcastss_avx512f(auVar118);
                        auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar118));
                        auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar118));
                        local_2c0[0] = (RTCHitN)auVar185[0];
                        local_2c0[1] = (RTCHitN)auVar185[1];
                        local_2c0[2] = (RTCHitN)auVar185[2];
                        local_2c0[3] = (RTCHitN)auVar185[3];
                        local_2c0[4] = (RTCHitN)auVar185[4];
                        local_2c0[5] = (RTCHitN)auVar185[5];
                        local_2c0[6] = (RTCHitN)auVar185[6];
                        local_2c0[7] = (RTCHitN)auVar185[7];
                        local_2c0[8] = (RTCHitN)auVar185[8];
                        local_2c0[9] = (RTCHitN)auVar185[9];
                        local_2c0[10] = (RTCHitN)auVar185[10];
                        local_2c0[0xb] = (RTCHitN)auVar185[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar185[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar185[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar185[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar185[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar185[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar185[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar185[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar185[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar185[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar185[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar185[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar185[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar185[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar185[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar185[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar185[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar185[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar185[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar185[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar185[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar185[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar185[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar185[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar185[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar185[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar185[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar185[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar185[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar185[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar185[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar185[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar185[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar185[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar185[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar185[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar185[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar185[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar185[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar185[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar185[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar185[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar185[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar185[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar185[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar185[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar185[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar185[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar185[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar185[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar185[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar185[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar185[0x3f];
                        local_280 = auVar214;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar185 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar185);
                        auVar126 = vpcmpeqd_avx2(auVar185._0_32_,auVar185._0_32_);
                        local_7f0[3] = auVar126;
                        local_7f0[2] = auVar126;
                        local_7f0[1] = auVar126;
                        *local_7f0 = auVar126;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar185 = vmovdqa64_avx512f(local_380);
                        local_700 = vmovdqa64_avx512f(auVar185);
                        local_830.valid = (int *)local_700;
                        local_830.geometryUserPtr = pGVar106->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar220 = ZEXT1664(auVar220._0_16_);
                          (*pGVar106->intersectionFilterN)(&local_830);
                          auVar225 = ZEXT3264(local_7a0);
                          auVar185 = vmovdqa64_avx512f(local_700);
                          pGVar106 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar35 = vptestmd_avx512f(auVar185,auVar185);
                        if ((short)uVar35 == 0) {
LAB_01a90d4f:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_800._0_4_;
                        }
                        else {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar106->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar214 = ZEXT1664(auVar214._0_16_);
                            auVar220 = ZEXT1664(auVar220._0_16_);
                            (*p_Var18)(&local_830);
                            auVar225 = ZEXT3264(local_7a0);
                            auVar185 = vmovdqa64_avx512f(local_700);
                            pGVar106 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar37 = vptestmd_avx512f(auVar185,auVar185);
                          if ((short)uVar37 == 0) goto LAB_01a90d4f;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar83 = *(int *)(local_830.hit + 0xc);
                          iVar84 = *(int *)(local_830.hit + 0x10);
                          iVar85 = *(int *)(local_830.hit + 0x14);
                          iVar86 = *(int *)(local_830.hit + 0x18);
                          iVar87 = *(int *)(local_830.hit + 0x1c);
                          iVar88 = *(int *)(local_830.hit + 0x20);
                          iVar89 = *(int *)(local_830.hit + 0x24);
                          iVar90 = *(int *)(local_830.hit + 0x28);
                          iVar91 = *(int *)(local_830.hit + 0x2c);
                          iVar92 = *(int *)(local_830.hit + 0x30);
                          iVar93 = *(int *)(local_830.hit + 0x34);
                          iVar94 = *(int *)(local_830.hit + 0x38);
                          iVar95 = *(int *)(local_830.hit + 0x3c);
                          bVar111 = (byte)uVar37;
                          bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                          bVar102 = (byte)(uVar37 >> 8);
                          bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                          bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                          bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                          bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                          bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                          bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                          bVar32 = SUB81(uVar37 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar111 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar102 & 1) * iVar88 |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar32 * iVar95 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar83 = *(int *)(local_830.hit + 0x4c);
                          iVar84 = *(int *)(local_830.hit + 0x50);
                          iVar85 = *(int *)(local_830.hit + 0x54);
                          iVar86 = *(int *)(local_830.hit + 0x58);
                          iVar87 = *(int *)(local_830.hit + 0x5c);
                          iVar88 = *(int *)(local_830.hit + 0x60);
                          iVar89 = *(int *)(local_830.hit + 100);
                          iVar90 = *(int *)(local_830.hit + 0x68);
                          iVar91 = *(int *)(local_830.hit + 0x6c);
                          iVar92 = *(int *)(local_830.hit + 0x70);
                          iVar93 = *(int *)(local_830.hit + 0x74);
                          iVar94 = *(int *)(local_830.hit + 0x78);
                          iVar95 = *(int *)(local_830.hit + 0x7c);
                          bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                          bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                          bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                          bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                          bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                          bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                          bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                          bVar32 = SUB81(uVar37 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar102 & 1) * iVar88 |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar32 * iVar95 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar83 = *(int *)(local_830.hit + 0x8c);
                          iVar84 = *(int *)(local_830.hit + 0x90);
                          iVar85 = *(int *)(local_830.hit + 0x94);
                          iVar86 = *(int *)(local_830.hit + 0x98);
                          iVar87 = *(int *)(local_830.hit + 0x9c);
                          iVar88 = *(int *)(local_830.hit + 0xa0);
                          iVar89 = *(int *)(local_830.hit + 0xa4);
                          iVar90 = *(int *)(local_830.hit + 0xa8);
                          iVar91 = *(int *)(local_830.hit + 0xac);
                          iVar92 = *(int *)(local_830.hit + 0xb0);
                          iVar93 = *(int *)(local_830.hit + 0xb4);
                          iVar94 = *(int *)(local_830.hit + 0xb8);
                          iVar95 = *(int *)(local_830.hit + 0xbc);
                          bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                          bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                          bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                          bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                          bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                          bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                          bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                          bVar32 = SUB81(uVar37 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar102 & 1) * iVar88 |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar32 * iVar95 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar83 = *(int *)(local_830.hit + 0xcc);
                          iVar84 = *(int *)(local_830.hit + 0xd0);
                          iVar85 = *(int *)(local_830.hit + 0xd4);
                          iVar86 = *(int *)(local_830.hit + 0xd8);
                          iVar87 = *(int *)(local_830.hit + 0xdc);
                          iVar88 = *(int *)(local_830.hit + 0xe0);
                          iVar89 = *(int *)(local_830.hit + 0xe4);
                          iVar90 = *(int *)(local_830.hit + 0xe8);
                          iVar91 = *(int *)(local_830.hit + 0xec);
                          iVar92 = *(int *)(local_830.hit + 0xf0);
                          iVar93 = *(int *)(local_830.hit + 0xf4);
                          iVar94 = *(int *)(local_830.hit + 0xf8);
                          iVar95 = *(int *)(local_830.hit + 0xfc);
                          bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                          bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                          bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                          bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                          bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                          bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                          bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                          bVar32 = SUB81(uVar37 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar102 & 1) * iVar88 |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar32 * iVar95 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar83 = *(int *)(local_830.hit + 0x10c);
                          iVar84 = *(int *)(local_830.hit + 0x110);
                          iVar85 = *(int *)(local_830.hit + 0x114);
                          iVar86 = *(int *)(local_830.hit + 0x118);
                          iVar87 = *(int *)(local_830.hit + 0x11c);
                          iVar88 = *(int *)(local_830.hit + 0x120);
                          iVar89 = *(int *)(local_830.hit + 0x124);
                          iVar90 = *(int *)(local_830.hit + 0x128);
                          iVar91 = *(int *)(local_830.hit + 300);
                          iVar92 = *(int *)(local_830.hit + 0x130);
                          iVar93 = *(int *)(local_830.hit + 0x134);
                          iVar94 = *(int *)(local_830.hit + 0x138);
                          iVar95 = *(int *)(local_830.hit + 0x13c);
                          bVar19 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar25 = (bool)((byte)(uVar37 >> 7) & 1);
                          bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
                          bVar27 = (bool)((byte)(uVar37 >> 10) & 1);
                          bVar28 = (bool)((byte)(uVar37 >> 0xb) & 1);
                          bVar29 = (bool)((byte)(uVar37 >> 0xc) & 1);
                          bVar30 = (bool)((byte)(uVar37 >> 0xd) & 1);
                          bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                          bVar32 = SUB81(uVar37 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar111 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar111 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar102 & 1) * iVar88 |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar32 * iVar95 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x43c);
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar185 = vmovdqu32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar185 = vmovdqu32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar185 = vmovdqa32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar185 = vmovdqa32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar185;
                          local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_800._4_4_ = 0;
                          local_800._8_4_ = 0;
                          local_800._12_4_ = 0;
                        }
                        auVar222 = ZEXT1664(auVar33);
                        bVar111 = ~(byte)(1 << ((uint)uVar103 & 0x1f)) & (byte)uVar109;
                        auVar181._4_4_ = local_800._0_4_;
                        auVar181._0_4_ = local_800._0_4_;
                        auVar181._8_4_ = local_800._0_4_;
                        auVar181._12_4_ = local_800._0_4_;
                        auVar181._16_4_ = local_800._0_4_;
                        auVar181._20_4_ = local_800._0_4_;
                        auVar181._24_4_ = local_800._0_4_;
                        auVar181._28_4_ = local_800._0_4_;
                        uVar35 = vcmpps_avx512vl(auVar225._0_32_,auVar181,2);
                        if ((bVar111 & (byte)uVar35) == 0) goto LAB_01a90dec;
                        bVar111 = bVar111 & (byte)uVar35;
                        uVar110 = (uint)bVar111;
                        uVar109 = (ulong)uVar110;
                        auVar182._8_4_ = 0x7f800000;
                        auVar182._0_8_ = 0x7f8000007f800000;
                        auVar182._12_4_ = 0x7f800000;
                        auVar182._16_4_ = 0x7f800000;
                        auVar182._20_4_ = 0x7f800000;
                        auVar182._24_4_ = 0x7f800000;
                        auVar182._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar182,auVar225._0_32_);
                        auVar162._0_4_ =
                             (uint)(bVar111 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 1 & 1);
                        auVar162._4_4_ = (uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 2 & 1);
                        auVar162._8_4_ = (uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 3 & 1);
                        auVar162._12_4_ =
                             (uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 4 & 1);
                        auVar162._16_4_ =
                             (uint)bVar19 * auVar126._16_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 5 & 1);
                        auVar162._20_4_ =
                             (uint)bVar19 * auVar126._20_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar111 >> 6 & 1);
                        auVar162._24_4_ =
                             (uint)bVar19 * auVar126._24_4_ | (uint)!bVar19 * 0x7f800000;
                        auVar162._28_4_ =
                             (uint)(bVar111 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar111 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar162,auVar162,0xb1);
                        auVar126 = vminps_avx(auVar162,auVar126);
                        auVar124 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar124);
                        auVar124 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar124);
                        uVar35 = vcmpps_avx512vl(auVar162,auVar126,0);
                        bVar111 = (byte)uVar35 & bVar111;
                        if (bVar111 != 0) {
                          uVar110 = (uint)bVar111;
                        }
                        uVar104 = 0;
                        for (; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x80000000) {
                          uVar104 = uVar104 + 1;
                        }
                        uVar103 = (ulong)uVar104;
                      } while( true );
                    }
                    fVar189 = local_4e0[uVar103];
                    uVar173 = *(undefined4 *)(local_4c0 + uVar103 * 4);
                    fVar186 = 1.0 - fVar189;
                    fVar172 = fVar186 * fVar186 * -3.0;
                    auVar214 = ZEXT464((uint)fVar172);
                    auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186)),
                                               ZEXT416((uint)(fVar189 * fVar186)),
                                               ZEXT416(0xc0000000));
                    auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar186)),
                                               ZEXT416((uint)(fVar189 * fVar189)),
                                               ZEXT416(0x40000000));
                    fVar186 = auVar118._0_4_ * 3.0;
                    fVar187 = auVar119._0_4_ * 3.0;
                    fVar198 = fVar189 * fVar189 * 3.0;
                    auVar216._0_4_ = fVar198 * local_890;
                    auVar216._4_4_ = fVar198 * fStack_88c;
                    auVar216._8_4_ = fVar198 * fStack_888;
                    auVar216._12_4_ = fVar198 * fStack_884;
                    auVar220 = ZEXT1664(auVar216);
                    auVar192._4_4_ = fVar187;
                    auVar192._0_4_ = fVar187;
                    auVar192._8_4_ = fVar187;
                    auVar192._12_4_ = fVar187;
                    auVar118 = vfmadd132ps_fma(auVar192,auVar216,auVar10);
                    auVar202._4_4_ = fVar186;
                    auVar202._0_4_ = fVar186;
                    auVar202._8_4_ = fVar186;
                    auVar202._12_4_ = fVar186;
                    auVar118 = vfmadd132ps_fma(auVar202,auVar118,auVar11);
                    auVar193._4_4_ = fVar172;
                    auVar193._0_4_ = fVar172;
                    auVar193._8_4_ = fVar172;
                    auVar193._12_4_ = fVar172;
                    auVar118 = vfmadd213ps_fma(auVar193,auVar33,auVar118);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar103 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar118._0_4_;
                    uVar17 = vextractps_avx(auVar118,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar17;
                    uVar17 = vextractps_avx(auVar118,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar17;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar189;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar173;
                    *(uint *)(ray + k * 4 + 0x440) = uVar15;
                    *(uint *)(ray + k * 4 + 0x480) = uVar14;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a90a0a;
      }
    }
    uVar173 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar44._4_4_ = uVar173;
    auVar44._0_4_ = uVar173;
    auVar44._8_4_ = uVar173;
    auVar44._12_4_ = uVar173;
    auVar44._16_4_ = uVar173;
    auVar44._20_4_ = uVar173;
    auVar44._24_4_ = uVar173;
    auVar44._28_4_ = uVar173;
    uVar34 = vcmpps_avx512vl(local_3a0,auVar44,2);
    uVar108 = (ulong)((uint)uVar108 & (uint)uVar34);
  } while( true );
LAB_01a90dec:
  auVar237 = ZEXT3264(local_760);
  auVar238 = ZEXT3264(local_780);
  auVar126 = vmovdqa64_avx512vl(local_460);
  auVar185 = ZEXT3264(auVar126);
LAB_01a90a0a:
  lVar105 = lVar105 + 8;
  goto LAB_01a90154;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }